

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  uint uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  int iVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  byte bVar81;
  byte bVar82;
  ulong uVar83;
  uint uVar84;
  long lVar85;
  long lVar86;
  Geometry *pGVar87;
  uint uVar88;
  ulong uVar89;
  byte bVar90;
  ulong uVar91;
  float fVar92;
  float fVar145;
  float fVar147;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar93;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar151;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined4 uVar152;
  undefined8 uVar153;
  vint4 bi_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 bi_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  vint4 bi;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar181;
  float fVar185;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar186;
  float fVar187;
  float fVar202;
  float fVar204;
  vint4 ai_2;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar205;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar203;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  vint4 ai_1;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  vint4 ai;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [64];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  Precalculations *local_6b8;
  undefined1 local_6b0 [16];
  RTCFilterFunctionNArguments local_698;
  Geometry *local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [8];
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  LinearSpace3fa *local_490;
  Primitive *local_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3d0 [16];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_320;
  int local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  byte local_2d0;
  float local_2c0 [4];
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  int local_250;
  int iStack_24c;
  int iStack_248;
  int iStack_244;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined1 local_1f0 [16];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_170 [16];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar83 = (ulong)(byte)PVar6;
  lVar26 = uVar83 * 0x25;
  fVar187 = *(float *)(prim + lVar26 + 0x12);
  auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar98 = vsubps_avx(auVar98,*(undefined1 (*) [16])(prim + lVar26 + 6));
  auVar182._0_4_ = fVar187 * auVar98._0_4_;
  auVar182._4_4_ = fVar187 * auVar98._4_4_;
  auVar182._8_4_ = fVar187 * auVar98._8_4_;
  auVar182._12_4_ = fVar187 * auVar98._12_4_;
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar154._0_4_ = fVar187 * auVar97._0_4_;
  auVar154._4_4_ = fVar187 * auVar97._4_4_;
  auVar154._8_4_ = fVar187 * auVar97._8_4_;
  auVar154._12_4_ = fVar187 * auVar97._12_4_;
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar83 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar206._4_4_ = auVar154._0_4_;
  auVar206._0_4_ = auVar154._0_4_;
  auVar206._8_4_ = auVar154._0_4_;
  auVar206._12_4_ = auVar154._0_4_;
  auVar100 = vshufps_avx(auVar154,auVar154,0x55);
  auVar101 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar187 = auVar101._0_4_;
  auVar172._0_4_ = fVar187 * auVar99._0_4_;
  fVar203 = auVar101._4_4_;
  auVar172._4_4_ = fVar203 * auVar99._4_4_;
  fVar186 = auVar101._8_4_;
  auVar172._8_4_ = fVar186 * auVar99._8_4_;
  fVar202 = auVar101._12_4_;
  auVar172._12_4_ = fVar202 * auVar99._12_4_;
  auVar168._0_4_ = auVar20._0_4_ * fVar187;
  auVar168._4_4_ = auVar20._4_4_ * fVar203;
  auVar168._8_4_ = auVar20._8_4_ * fVar186;
  auVar168._12_4_ = auVar20._12_4_ * fVar202;
  auVar155._0_4_ = auVar23._0_4_ * fVar187;
  auVar155._4_4_ = auVar23._4_4_ * fVar203;
  auVar155._8_4_ = auVar23._8_4_ * fVar186;
  auVar155._12_4_ = auVar23._12_4_ * fVar202;
  auVar101 = vfmadd231ps_fma(auVar172,auVar100,auVar97);
  auVar28 = vfmadd231ps_fma(auVar168,auVar100,auVar234);
  auVar100 = vfmadd231ps_fma(auVar155,auVar22,auVar100);
  auVar102 = vfmadd231ps_fma(auVar101,auVar206,auVar98);
  auVar28 = vfmadd231ps_fma(auVar28,auVar206,auVar103);
  auVar29 = vfmadd231ps_fma(auVar100,auVar21,auVar206);
  auVar224._4_4_ = auVar182._0_4_;
  auVar224._0_4_ = auVar182._0_4_;
  auVar224._8_4_ = auVar182._0_4_;
  auVar224._12_4_ = auVar182._0_4_;
  auVar100 = vshufps_avx(auVar182,auVar182,0x55);
  auVar101 = vshufps_avx(auVar182,auVar182,0xaa);
  fVar187 = auVar101._0_4_;
  auVar207._0_4_ = fVar187 * auVar99._0_4_;
  fVar203 = auVar101._4_4_;
  auVar207._4_4_ = fVar203 * auVar99._4_4_;
  fVar186 = auVar101._8_4_;
  auVar207._8_4_ = fVar186 * auVar99._8_4_;
  fVar202 = auVar101._12_4_;
  auVar207._12_4_ = fVar202 * auVar99._12_4_;
  auVar188._0_4_ = auVar20._0_4_ * fVar187;
  auVar188._4_4_ = auVar20._4_4_ * fVar203;
  auVar188._8_4_ = auVar20._8_4_ * fVar186;
  auVar188._12_4_ = auVar20._12_4_ * fVar202;
  auVar183._0_4_ = auVar23._0_4_ * fVar187;
  auVar183._4_4_ = auVar23._4_4_ * fVar203;
  auVar183._8_4_ = auVar23._8_4_ * fVar186;
  auVar183._12_4_ = auVar23._12_4_ * fVar202;
  auVar97 = vfmadd231ps_fma(auVar207,auVar100,auVar97);
  auVar99 = vfmadd231ps_fma(auVar188,auVar100,auVar234);
  auVar234 = vfmadd231ps_fma(auVar183,auVar100,auVar22);
  auVar30 = vfmadd231ps_fma(auVar97,auVar224,auVar98);
  auVar154 = vfmadd231ps_fma(auVar99,auVar224,auVar103);
  auVar216._8_4_ = 0x7fffffff;
  auVar216._0_8_ = 0x7fffffff7fffffff;
  auVar216._12_4_ = 0x7fffffff;
  auVar155 = vfmadd231ps_fma(auVar234,auVar224,auVar21);
  auVar98 = vandps_avx(auVar216,auVar102);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar98,auVar213,1);
  bVar13 = (bool)((byte)uVar89 & 1);
  auVar94._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._0_4_;
  bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._4_4_;
  bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._8_4_;
  bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar102._12_4_;
  auVar98 = vandps_avx(auVar216,auVar28);
  uVar89 = vcmpps_avx512vl(auVar98,auVar213,1);
  bVar13 = (bool)((byte)uVar89 & 1);
  auVar95._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._0_4_;
  bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._4_4_;
  bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._8_4_;
  bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar28._12_4_;
  auVar98 = vandps_avx(auVar216,auVar29);
  uVar89 = vcmpps_avx512vl(auVar98,auVar213,1);
  bVar13 = (bool)((byte)uVar89 & 1);
  auVar96._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._0_4_;
  bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._4_4_;
  bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._8_4_;
  bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar29._12_4_;
  auVar97 = vrcp14ps_avx512vl(auVar94);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = &DAT_3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar98 = vfnmadd213ps_fma(auVar94,auVar97,auVar214);
  auVar102 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar95);
  auVar98 = vfnmadd213ps_fma(auVar95,auVar97,auVar214);
  auVar29 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
  auVar97 = vrcp14ps_avx512vl(auVar96);
  auVar98 = vfnmadd213ps_fma(auVar96,auVar97,auVar214);
  auVar27 = vfmadd132ps_fma(auVar98,auVar97,auVar97);
  fVar187 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  auVar211._4_4_ = fVar187;
  auVar211._0_4_ = fVar187;
  auVar211._8_4_ = fVar187;
  auVar211._12_4_ = fVar187;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar98 = vpmovsxwd_avx(auVar98);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar97 = vpmovsxwd_avx(auVar97);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar103 = vsubps_avx(auVar97,auVar98);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar97 = vpmovsxwd_avx(auVar99);
  auVar99 = vfmadd213ps_fma(auVar103,auVar211,auVar98);
  auVar98 = vcvtdq2ps_avx(auVar97);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar97 = vpmovsxwd_avx(auVar103);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar103 = vfmadd213ps_fma(auVar97,auVar211,auVar98);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar98 = vpmovsxwd_avx(auVar234);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar89 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar83 * 2 + uVar89 + 6);
  auVar97 = vpmovsxwd_avx(auVar20);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar234 = vfmadd213ps_fma(auVar97,auVar211,auVar98);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar89 + 6);
  auVar98 = vpmovsxwd_avx(auVar21);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar97 = vpmovsxwd_avx(auVar22);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar20 = vfmadd213ps_fma(auVar97,auVar211,auVar98);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar98 = vpmovsxwd_avx(auVar23);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar83 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar97 = vpmovsxwd_avx(auVar100);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar21 = vfmadd213ps_fma(auVar97,auVar211,auVar98);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar83) + 6);
  auVar98 = vpmovsxwd_avx(auVar101);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar97 = vpmovsxwd_avx(auVar28);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar97 = vsubps_avx(auVar97,auVar98);
  auVar97 = vfmadd213ps_fma(auVar97,auVar211,auVar98);
  auVar98 = vsubps_avx(auVar99,auVar30);
  auVar212._0_4_ = auVar102._0_4_ * auVar98._0_4_;
  auVar212._4_4_ = auVar102._4_4_ * auVar98._4_4_;
  auVar212._8_4_ = auVar102._8_4_ * auVar98._8_4_;
  auVar212._12_4_ = auVar102._12_4_ * auVar98._12_4_;
  auVar98 = vsubps_avx(auVar103,auVar30);
  auVar173._0_4_ = auVar102._0_4_ * auVar98._0_4_;
  auVar173._4_4_ = auVar102._4_4_ * auVar98._4_4_;
  auVar173._8_4_ = auVar102._8_4_ * auVar98._8_4_;
  auVar173._12_4_ = auVar102._12_4_ * auVar98._12_4_;
  auVar98 = vsubps_avx(auVar234,auVar154);
  auVar208._0_4_ = auVar29._0_4_ * auVar98._0_4_;
  auVar208._4_4_ = auVar29._4_4_ * auVar98._4_4_;
  auVar208._8_4_ = auVar29._8_4_ * auVar98._8_4_;
  auVar208._12_4_ = auVar29._12_4_ * auVar98._12_4_;
  auVar98 = vsubps_avx(auVar20,auVar154);
  auVar169._0_4_ = auVar29._0_4_ * auVar98._0_4_;
  auVar169._4_4_ = auVar29._4_4_ * auVar98._4_4_;
  auVar169._8_4_ = auVar29._8_4_ * auVar98._8_4_;
  auVar169._12_4_ = auVar29._12_4_ * auVar98._12_4_;
  auVar98 = vsubps_avx(auVar21,auVar155);
  auVar189._0_4_ = auVar27._0_4_ * auVar98._0_4_;
  auVar189._4_4_ = auVar27._4_4_ * auVar98._4_4_;
  auVar189._8_4_ = auVar27._8_4_ * auVar98._8_4_;
  auVar189._12_4_ = auVar27._12_4_ * auVar98._12_4_;
  auVar98 = vsubps_avx(auVar97,auVar155);
  auVar156._0_4_ = auVar27._0_4_ * auVar98._0_4_;
  auVar156._4_4_ = auVar27._4_4_ * auVar98._4_4_;
  auVar156._8_4_ = auVar27._8_4_ * auVar98._8_4_;
  auVar156._12_4_ = auVar27._12_4_ * auVar98._12_4_;
  auVar98 = vpminsd_avx(auVar212,auVar173);
  auVar97 = vpminsd_avx(auVar208,auVar169);
  auVar98 = vmaxps_avx(auVar98,auVar97);
  auVar97 = vpminsd_avx(auVar189,auVar156);
  uVar152 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar102._4_4_ = uVar152;
  auVar102._0_4_ = uVar152;
  auVar102._8_4_ = uVar152;
  auVar102._12_4_ = uVar152;
  auVar97 = vmaxps_avx512vl(auVar97,auVar102);
  auVar98 = vmaxps_avx(auVar98,auVar97);
  auVar29._8_4_ = 0x3f7ffffa;
  auVar29._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar29._12_4_ = 0x3f7ffffa;
  local_170 = vmulps_avx512vl(auVar98,auVar29);
  auVar98 = vpmaxsd_avx(auVar212,auVar173);
  auVar97 = vpmaxsd_avx(auVar208,auVar169);
  auVar98 = vminps_avx(auVar98,auVar97);
  auVar97 = vpmaxsd_avx(auVar189,auVar156);
  uVar152 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar27._4_4_ = uVar152;
  auVar27._0_4_ = uVar152;
  auVar27._8_4_ = uVar152;
  auVar27._12_4_ = uVar152;
  auVar97 = vminps_avx512vl(auVar97,auVar27);
  auVar98 = vminps_avx(auVar98,auVar97);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar30);
  auVar97 = vpbroadcastd_avx512vl();
  uVar153 = vcmpps_avx512vl(local_170,auVar98,2);
  uVar89 = vpcmpgtd_avx512vl(auVar97,_DAT_01ff0cf0);
  uVar89 = ((byte)uVar153 & 0xf) & uVar89;
  if ((char)uVar89 != '\0') {
    local_490 = pre->ray_space + k;
    local_3d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_6b8 = pre;
    local_488 = prim;
    do {
      lVar26 = 0;
      for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar88 = *(uint *)(local_488 + 2);
      uVar7 = *(uint *)(local_488 + lVar26 * 4 + 6);
      pGVar87 = (context->scene->geometries).items[uVar88].ptr;
      uVar83 = (ulong)*(uint *)(*(long *)&pGVar87->field_0x58 +
                               (ulong)uVar7 *
                               pGVar87[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar187 = (pGVar87->time_range).lower;
      fVar187 = pGVar87->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar187) /
                ((pGVar87->time_range).upper - fVar187));
      auVar98 = vroundss_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),9);
      auVar98 = vminss_avx(auVar98,ZEXT416((uint)(pGVar87->fnumTimeSegments + -1.0)));
      auVar98 = vmaxss_avx(ZEXT816(0) << 0x20,auVar98);
      fVar187 = fVar187 - auVar98._0_4_;
      _Var10 = pGVar87[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar86 = (long)(int)auVar98._0_4_ * 0x38;
      lVar26 = *(long *)(_Var10 + 0x10 + lVar86);
      lVar85 = *(long *)(_Var10 + 0x38 + lVar86);
      lVar11 = *(long *)(_Var10 + 0x48 + lVar86);
      auVar170._4_4_ = fVar187;
      auVar170._0_4_ = fVar187;
      auVar170._8_4_ = fVar187;
      auVar170._12_4_ = fVar187;
      pfVar3 = (float *)(lVar85 + uVar83 * lVar11);
      auVar217._0_4_ = fVar187 * *pfVar3;
      auVar217._4_4_ = fVar187 * pfVar3[1];
      auVar217._8_4_ = fVar187 * pfVar3[2];
      auVar217._12_4_ = fVar187 * pfVar3[3];
      pfVar3 = (float *)(lVar85 + (uVar83 + 1) * lVar11);
      auVar218._0_4_ = fVar187 * *pfVar3;
      auVar218._4_4_ = fVar187 * pfVar3[1];
      auVar218._8_4_ = fVar187 * pfVar3[2];
      auVar218._12_4_ = fVar187 * pfVar3[3];
      auVar98 = vmulps_avx512vl(auVar170,*(undefined1 (*) [16])(lVar85 + (uVar83 + 2) * lVar11));
      auVar97 = vmulps_avx512vl(auVar170,*(undefined1 (*) [16])(lVar85 + lVar11 * (uVar83 + 3)));
      lVar85 = *(long *)(_Var10 + lVar86);
      fVar187 = 1.0 - fVar187;
      auVar157._4_4_ = fVar187;
      auVar157._0_4_ = fVar187;
      auVar157._8_4_ = fVar187;
      auVar157._12_4_ = fVar187;
      local_6b0 = vfmadd231ps_fma(auVar217,auVar157,*(undefined1 (*) [16])(lVar85 + lVar26 * uVar83)
                                 );
      local_5d0 = vfmadd231ps_fma(auVar218,auVar157,
                                  *(undefined1 (*) [16])(lVar85 + lVar26 * (uVar83 + 1)));
      local_5e0 = vfmadd231ps_avx512vl
                            (auVar98,auVar157,*(undefined1 (*) [16])(lVar85 + lVar26 * (uVar83 + 2))
                            );
      _local_5f0 = vfmadd231ps_avx512vl
                             (auVar97,auVar157,
                              *(undefined1 (*) [16])(lVar85 + lVar26 * (uVar83 + 3)));
      iVar8 = (int)pGVar87[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar98 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      lVar26 = (long)iVar8 * 0x44;
      auVar98 = vinsertps_avx(auVar98,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar99 = vsubps_avx(local_6b0,auVar98);
      uVar152 = auVar99._0_4_;
      auVar174._4_4_ = uVar152;
      auVar174._0_4_ = uVar152;
      auVar174._8_4_ = uVar152;
      auVar174._12_4_ = uVar152;
      auVar97 = vshufps_avx(auVar99,auVar99,0x55);
      aVar4 = (local_490->vx).field_0;
      aVar5 = (local_490->vy).field_0;
      fVar187 = (local_490->vz).field_0.m128[0];
      fVar203 = *(float *)((long)&(local_490->vz).field_0 + 4);
      fVar186 = *(float *)((long)&(local_490->vz).field_0 + 8);
      fVar202 = *(float *)((long)&(local_490->vz).field_0 + 0xc);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar220._0_4_ = fVar187 * auVar99._0_4_;
      auVar220._4_4_ = fVar203 * auVar99._4_4_;
      auVar220._8_4_ = fVar186 * auVar99._8_4_;
      auVar220._12_4_ = fVar202 * auVar99._12_4_;
      auVar97 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar5,auVar97);
      auVar103 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar4,auVar174);
      auVar99 = vsubps_avx(local_5d0,auVar98);
      uVar152 = auVar99._0_4_;
      auVar175._4_4_ = uVar152;
      auVar175._0_4_ = uVar152;
      auVar175._8_4_ = uVar152;
      auVar175._12_4_ = uVar152;
      auVar97 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar221._0_4_ = fVar187 * auVar99._0_4_;
      auVar221._4_4_ = fVar203 * auVar99._4_4_;
      auVar221._8_4_ = fVar186 * auVar99._8_4_;
      auVar221._12_4_ = fVar202 * auVar99._12_4_;
      auVar97 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar5,auVar97);
      auVar234 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar4,auVar175);
      auVar99 = vsubps_avx512vl(local_5e0,auVar98);
      uVar152 = auVar99._0_4_;
      auVar176._4_4_ = uVar152;
      auVar176._0_4_ = uVar152;
      auVar176._8_4_ = uVar152;
      auVar176._12_4_ = uVar152;
      auVar97 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar222._0_4_ = fVar187 * auVar99._0_4_;
      auVar222._4_4_ = fVar203 * auVar99._4_4_;
      auVar222._8_4_ = fVar186 * auVar99._8_4_;
      auVar222._12_4_ = fVar202 * auVar99._12_4_;
      auVar97 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar5,auVar97);
      auVar99 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar4,auVar176);
      auVar97 = vsubps_avx512vl(_local_5f0,auVar98);
      uVar152 = auVar97._0_4_;
      auVar171._4_4_ = uVar152;
      auVar171._0_4_ = uVar152;
      auVar171._8_4_ = uVar152;
      auVar171._12_4_ = uVar152;
      auVar98 = vshufps_avx(auVar97,auVar97,0x55);
      auVar97 = vshufps_avx(auVar97,auVar97,0xaa);
      auVar226._0_4_ = fVar187 * auVar97._0_4_;
      auVar226._4_4_ = fVar203 * auVar97._4_4_;
      auVar226._8_4_ = fVar186 * auVar97._8_4_;
      auVar226._12_4_ = fVar202 * auVar97._12_4_;
      auVar98 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar98);
      auVar20 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar4,auVar171);
      auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar26);
      uVar152 = auVar103._0_4_;
      local_420._4_4_ = uVar152;
      local_420._0_4_ = uVar152;
      local_420._8_4_ = uVar152;
      local_420._12_4_ = uVar152;
      local_420._16_4_ = uVar152;
      local_420._20_4_ = uVar152;
      local_420._24_4_ = uVar152;
      local_420._28_4_ = uVar152;
      auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x484);
      auVar106._8_4_ = 1;
      auVar106._0_8_ = 0x100000001;
      auVar106._12_4_ = 1;
      auVar106._16_4_ = 1;
      auVar106._20_4_ = 1;
      auVar106._24_4_ = 1;
      auVar106._28_4_ = 1;
      local_400 = vpermps_avx2(auVar106,ZEXT1632(auVar103));
      local_440 = vbroadcastss_avx512vl(auVar234);
      local_640 = vpermps_avx512vl(auVar106,ZEXT1632(auVar234));
      auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x908);
      local_660 = vbroadcastss_avx512vl(auVar99);
      local_500 = vpermps_avx512vl(auVar106,ZEXT1632(auVar99));
      auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0xd8c);
      local_520 = vbroadcastss_avx512vl(auVar20);
      auVar237 = ZEXT3264(local_520);
      local_540 = vpermps_avx512vl(auVar106,ZEXT1632(auVar20));
      auVar238 = ZEXT3264(local_540);
      auVar106 = vmulps_avx512vl(local_520,auVar118);
      auVar107 = vmulps_avx512vl(local_540,auVar118);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar119,local_660);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar119,local_500);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar123,local_440);
      auVar108 = vfmadd231ps_avx512vl(auVar107,auVar123,local_640);
      auVar109 = vfmadd231ps_avx512vl(auVar106,auVar121,local_420);
      auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar26);
      auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x484);
      auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x908);
      auVar110 = vfmadd231ps_avx512vl(auVar108,auVar121,local_400);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0xd8c);
      auVar111 = vmulps_avx512vl(local_520,auVar108);
      auVar112 = vmulps_avx512vl(local_540,auVar108);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,local_660);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar117,local_500);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,local_440);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar107,local_640);
      auVar21 = vfmadd231ps_fma(auVar111,auVar106,local_420);
      auVar22 = vfmadd231ps_fma(auVar112,auVar106,local_400);
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar21),auVar109);
      auVar113 = vsubps_avx512vl(ZEXT1632(auVar22),auVar110);
      auVar111 = vmulps_avx512vl(auVar110,auVar112);
      auVar114 = vmulps_avx512vl(auVar109,auVar113);
      auVar111 = vsubps_avx512vl(auVar111,auVar114);
      auVar98 = vshufps_avx(local_6b0,local_6b0,0xff);
      uVar153 = auVar98._0_8_;
      local_80._8_8_ = uVar153;
      local_80._0_8_ = uVar153;
      local_80._16_8_ = uVar153;
      local_80._24_8_ = uVar153;
      auVar98 = vshufps_avx(local_5d0,local_5d0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar98);
      auVar98 = vshufps_avx512vl(local_5e0,local_5e0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar98);
      auVar98 = vshufps_avx512vl(_local_5f0,_local_5f0,0xff);
      uVar153 = auVar98._0_8_;
      register0x00001248 = uVar153;
      local_e0 = uVar153;
      register0x00001250 = uVar153;
      register0x00001258 = uVar153;
      auVar114 = vmulps_avx512vl(_local_e0,auVar118);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar119,local_c0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar123,local_a0);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar121,local_80);
      auVar115 = vmulps_avx512vl(_local_e0,auVar108);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,local_c0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar107,local_a0);
      auVar23 = vfmadd231ps_fma(auVar115,auVar106,local_80);
      auVar115 = vmulps_avx512vl(auVar113,auVar113);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar112);
      auVar116 = vmaxps_avx512vl(auVar114,ZEXT1632(auVar23));
      auVar116 = vmulps_avx512vl(auVar116,auVar116);
      auVar115 = vmulps_avx512vl(auVar116,auVar115);
      auVar111 = vmulps_avx512vl(auVar111,auVar111);
      uVar153 = vcmpps_avx512vl(auVar111,auVar115,2);
      auVar98 = vblendps_avx(auVar103,local_6b0,8);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar97 = vandps_avx512vl(auVar98,auVar100);
      auVar98 = vblendps_avx(auVar234,local_5d0,8);
      auVar98 = vandps_avx512vl(auVar98,auVar100);
      auVar97 = vmaxps_avx(auVar97,auVar98);
      auVar98 = vblendps_avx(auVar99,local_5e0,8);
      auVar101 = vandps_avx512vl(auVar98,auVar100);
      auVar98 = vblendps_avx(auVar20,_local_5f0,8);
      auVar98 = vandps_avx512vl(auVar98,auVar100);
      auVar98 = vmaxps_avx(auVar101,auVar98);
      auVar98 = vmaxps_avx(auVar97,auVar98);
      auVar97 = vmovshdup_avx(auVar98);
      auVar97 = vmaxss_avx(auVar97,auVar98);
      auVar98 = vshufpd_avx(auVar98,auVar98,1);
      auVar98 = vmaxss_avx(auVar98,auVar97);
      _local_3a0 = vcvtsi2ss_avx512f(local_5e0,iVar8);
      auVar115._0_4_ = local_3a0._0_4_;
      auVar115._4_4_ = auVar115._0_4_;
      auVar115._8_4_ = auVar115._0_4_;
      auVar115._12_4_ = auVar115._0_4_;
      auVar115._16_4_ = auVar115._0_4_;
      auVar115._20_4_ = auVar115._0_4_;
      auVar115._24_4_ = auVar115._0_4_;
      auVar115._28_4_ = auVar115._0_4_;
      uVar24 = vcmpps_avx512vl(auVar115,_DAT_02020f40,0xe);
      bVar90 = (byte)uVar153 & (byte)uVar24;
      fVar203 = auVar98._0_4_ * 4.7683716e-07;
      auVar111._8_4_ = 2;
      auVar111._0_8_ = 0x200000002;
      auVar111._12_4_ = 2;
      auVar111._16_4_ = 2;
      auVar111._20_4_ = 2;
      auVar111._24_4_ = 2;
      auVar111._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar111,ZEXT1632(auVar103));
      local_120 = vpermps_avx512vl(auVar111,ZEXT1632(auVar234));
      local_140 = vpermps_avx512vl(auVar111,ZEXT1632(auVar99));
      auVar111 = vpermps_avx2(auVar111,ZEXT1632(auVar20));
      fVar187 = *(float *)(ray + k * 4 + 0x30);
      auVar98 = auVar113._0_16_;
      _local_610 = ZEXT416((uint)fVar203);
      if (bVar90 == 0) {
        auVar98 = vxorps_avx512vl(auVar98,auVar98);
        auVar235 = ZEXT1664(auVar98);
        auVar231 = ZEXT3264(local_420);
        auVar232 = ZEXT3264(local_400);
        auVar233 = ZEXT3264(local_440);
        auVar229 = ZEXT3264(local_640);
        auVar239 = ZEXT3264(local_660);
        auVar236 = ZEXT3264(local_500);
      }
      else {
        fStack_47c = 0.0;
        fStack_478 = 0.0;
        fStack_474 = 0.0;
        auVar108 = vmulps_avx512vl(auVar111,auVar108);
        auVar117 = vfmadd213ps_avx512vl(auVar117,local_140,auVar108);
        auVar107 = vfmadd213ps_avx512vl(auVar107,local_120,auVar117);
        auVar116 = vfmadd213ps_avx512vl(auVar106,local_100,auVar107);
        auVar118 = vmulps_avx512vl(auVar111,auVar118);
        auVar119 = vfmadd213ps_avx512vl(auVar119,local_140,auVar118);
        auVar107 = vfmadd213ps_avx512vl(auVar123,local_120,auVar119);
        auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1210);
        auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1694);
        auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1b18);
        auVar106 = *(undefined1 (*) [32])(bspline_basis0 + lVar26 + 0x1f9c);
        auVar120 = vfmadd213ps_avx512vl(auVar121,local_100,auVar107);
        auVar121 = vmulps_avx512vl(local_520,auVar106);
        auVar107 = vmulps_avx512vl(local_540,auVar106);
        auVar223._0_4_ = auVar111._0_4_ * auVar106._0_4_;
        auVar223._4_4_ = auVar111._4_4_ * auVar106._4_4_;
        auVar223._8_4_ = auVar111._8_4_ * auVar106._8_4_;
        auVar223._12_4_ = auVar111._12_4_ * auVar106._12_4_;
        auVar223._16_4_ = auVar111._16_4_ * auVar106._16_4_;
        auVar223._20_4_ = auVar111._20_4_ * auVar106._20_4_;
        auVar223._24_4_ = auVar111._24_4_ * auVar106._24_4_;
        auVar223._28_4_ = 0;
        auVar239 = ZEXT3264(local_660);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar118,local_660);
        auVar106 = vfmadd231ps_avx512vl(auVar107,auVar118,local_500);
        auVar118 = vfmadd231ps_avx512vl(auVar223,local_140,auVar118);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar119,local_440);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar119,local_640);
        auVar107 = vfmadd231ps_avx512vl(auVar118,local_120,auVar119);
        auVar117 = vfmadd231ps_avx512vl(auVar121,auVar123,local_420);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar123,local_400);
        auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1210);
        auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1b18);
        auVar118 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1f9c);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_100,auVar123);
        auVar108 = vmulps_avx512vl(local_520,auVar118);
        auVar122 = vmulps_avx512vl(local_540,auVar118);
        auVar123._4_4_ = auVar111._4_4_ * auVar118._4_4_;
        auVar123._0_4_ = auVar111._0_4_ * auVar118._0_4_;
        auVar123._8_4_ = auVar111._8_4_ * auVar118._8_4_;
        auVar123._12_4_ = auVar111._12_4_ * auVar118._12_4_;
        auVar123._16_4_ = auVar111._16_4_ * auVar118._16_4_;
        auVar123._20_4_ = auVar111._20_4_ * auVar118._20_4_;
        auVar123._24_4_ = auVar111._24_4_ * auVar118._24_4_;
        auVar123._28_4_ = auVar118._28_4_;
        auVar118 = vfmadd231ps_avx512vl(auVar108,auVar119,local_660);
        auVar108 = vfmadd231ps_avx512vl(auVar122,auVar119,local_500);
        auVar119 = vfmadd231ps_avx512vl(auVar123,local_140,auVar119);
        auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar26 + 0x1694);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar123,local_440);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar123,local_640);
        auVar123 = vfmadd231ps_avx512vl(auVar119,local_120,auVar123);
        auVar119 = vfmadd231ps_avx512vl(auVar118,auVar121,local_420);
        auVar118 = vfmadd231ps_avx512vl(auVar108,auVar121,local_400);
        auVar108 = vfmadd231ps_avx512vl(auVar123,local_100,auVar121);
        auVar227._8_4_ = 0x7fffffff;
        auVar227._0_8_ = 0x7fffffff7fffffff;
        auVar227._12_4_ = 0x7fffffff;
        auVar227._16_4_ = 0x7fffffff;
        auVar227._20_4_ = 0x7fffffff;
        auVar227._24_4_ = 0x7fffffff;
        auVar227._28_4_ = 0x7fffffff;
        auVar121 = vandps_avx(auVar117,auVar227);
        auVar123 = vandps_avx(auVar106,auVar227);
        auVar123 = vmaxps_avx(auVar121,auVar123);
        auVar121 = vandps_avx(auVar107,auVar227);
        auVar121 = vmaxps_avx(auVar123,auVar121);
        auVar107 = vbroadcastss_avx512vl(_local_610);
        uVar83 = vcmpps_avx512vl(auVar121,auVar107,1);
        bVar13 = (bool)((byte)uVar83 & 1);
        auVar122._0_4_ = (float)((uint)bVar13 * auVar112._0_4_ | (uint)!bVar13 * auVar117._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar117._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar117._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar117._12_4_);
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * auVar117._16_4_);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * auVar117._20_4_);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * auVar117._24_4_);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar122._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * auVar117._28_4_;
        bVar13 = (bool)((byte)uVar83 & 1);
        auVar124._0_4_ = (float)((uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar106._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar106._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar106._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar106._12_4_);
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar124._16_4_ = (float)((uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar106._16_4_);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar124._20_4_ = (float)((uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar106._20_4_);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar124._24_4_ = (float)((uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar106._24_4_);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar124._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar106._28_4_;
        auVar121 = vandps_avx(auVar227,auVar119);
        auVar123 = vandps_avx(auVar118,auVar227);
        auVar123 = vmaxps_avx(auVar121,auVar123);
        auVar121 = vandps_avx(auVar108,auVar227);
        auVar121 = vmaxps_avx(auVar123,auVar121);
        uVar83 = vcmpps_avx512vl(auVar121,auVar107,1);
        bVar13 = (bool)((byte)uVar83 & 1);
        auVar125._0_4_ = (float)((uint)bVar13 * auVar112._0_4_ | (uint)!bVar13 * auVar119._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar119._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar119._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar119._12_4_);
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * auVar119._16_4_);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * auVar119._20_4_);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * auVar119._24_4_);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar125._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * auVar119._28_4_;
        bVar13 = (bool)((byte)uVar83 & 1);
        auVar126._0_4_ = (float)((uint)bVar13 * auVar113._0_4_ | (uint)!bVar13 * auVar118._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar13 * auVar113._4_4_ | (uint)!bVar13 * auVar118._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar13 * auVar113._8_4_ | (uint)!bVar13 * auVar118._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar13 * auVar113._12_4_ | (uint)!bVar13 * auVar118._12_4_);
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar13 * auVar113._16_4_ | (uint)!bVar13 * auVar118._16_4_);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar13 * auVar113._20_4_ | (uint)!bVar13 * auVar118._20_4_);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar13 * auVar113._24_4_ | (uint)!bVar13 * auVar118._24_4_);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar126._28_4_ = (uint)bVar13 * auVar113._28_4_ | (uint)!bVar13 * auVar118._28_4_;
        auVar102 = vxorps_avx512vl(auVar98,auVar98);
        auVar235 = ZEXT1664(auVar102);
        auVar121 = vfmadd213ps_avx512vl(auVar122,auVar122,ZEXT1632(auVar102));
        auVar98 = vfmadd231ps_fma(auVar121,auVar124,auVar124);
        auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar98));
        fVar186 = auVar123._0_4_;
        fVar202 = auVar123._4_4_;
        fVar204 = auVar123._8_4_;
        fVar205 = auVar123._12_4_;
        fVar181 = auVar123._16_4_;
        fVar185 = auVar123._20_4_;
        fVar92 = auVar123._24_4_;
        auVar121._4_4_ = fVar202 * fVar202 * fVar202 * auVar98._4_4_ * -0.5;
        auVar121._0_4_ = fVar186 * fVar186 * fVar186 * auVar98._0_4_ * -0.5;
        auVar121._8_4_ = fVar204 * fVar204 * fVar204 * auVar98._8_4_ * -0.5;
        auVar121._12_4_ = fVar205 * fVar205 * fVar205 * auVar98._12_4_ * -0.5;
        auVar121._16_4_ = fVar181 * fVar181 * fVar181 * -0.0;
        auVar121._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar121._24_4_ = fVar92 * fVar92 * fVar92 * -0.0;
        auVar121._28_4_ = auVar108._28_4_;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar106,auVar123);
        auVar119._4_4_ = auVar124._4_4_ * auVar121._4_4_;
        auVar119._0_4_ = auVar124._0_4_ * auVar121._0_4_;
        auVar119._8_4_ = auVar124._8_4_ * auVar121._8_4_;
        auVar119._12_4_ = auVar124._12_4_ * auVar121._12_4_;
        auVar119._16_4_ = auVar124._16_4_ * auVar121._16_4_;
        auVar119._20_4_ = auVar124._20_4_ * auVar121._20_4_;
        auVar119._24_4_ = auVar124._24_4_ * auVar121._24_4_;
        auVar119._28_4_ = 0;
        auVar118._4_4_ = auVar121._4_4_ * -auVar122._4_4_;
        auVar118._0_4_ = auVar121._0_4_ * -auVar122._0_4_;
        auVar118._8_4_ = auVar121._8_4_ * -auVar122._8_4_;
        auVar118._12_4_ = auVar121._12_4_ * -auVar122._12_4_;
        auVar118._16_4_ = auVar121._16_4_ * -auVar122._16_4_;
        auVar118._20_4_ = auVar121._20_4_ * -auVar122._20_4_;
        auVar118._24_4_ = auVar121._24_4_ * -auVar122._24_4_;
        auVar118._28_4_ = auVar124._28_4_;
        auVar121 = vmulps_avx512vl(auVar121,ZEXT1632(auVar102));
        auVar112 = ZEXT1632(auVar102);
        auVar123 = vfmadd213ps_avx512vl(auVar125,auVar125,auVar112);
        auVar98 = vfmadd231ps_fma(auVar123,auVar126,auVar126);
        auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar98));
        fVar186 = auVar123._0_4_;
        fVar202 = auVar123._4_4_;
        fVar204 = auVar123._8_4_;
        fVar205 = auVar123._12_4_;
        fVar181 = auVar123._16_4_;
        fVar185 = auVar123._20_4_;
        fVar92 = auVar123._24_4_;
        auVar107._4_4_ = fVar202 * fVar202 * fVar202 * auVar98._4_4_ * -0.5;
        auVar107._0_4_ = fVar186 * fVar186 * fVar186 * auVar98._0_4_ * -0.5;
        auVar107._8_4_ = fVar204 * fVar204 * fVar204 * auVar98._8_4_ * -0.5;
        auVar107._12_4_ = fVar205 * fVar205 * fVar205 * auVar98._12_4_ * -0.5;
        auVar107._16_4_ = fVar181 * fVar181 * fVar181 * -0.0;
        auVar107._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar107._24_4_ = fVar92 * fVar92 * fVar92 * -0.0;
        auVar107._28_4_ = 0;
        auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar123);
        auVar117._4_4_ = auVar126._4_4_ * auVar106._4_4_;
        auVar117._0_4_ = auVar126._0_4_ * auVar106._0_4_;
        auVar117._8_4_ = auVar126._8_4_ * auVar106._8_4_;
        auVar117._12_4_ = auVar126._12_4_ * auVar106._12_4_;
        auVar117._16_4_ = auVar126._16_4_ * auVar106._16_4_;
        auVar117._20_4_ = auVar126._20_4_ * auVar106._20_4_;
        auVar117._24_4_ = auVar126._24_4_ * auVar106._24_4_;
        auVar117._28_4_ = auVar123._28_4_;
        auVar108._4_4_ = -auVar125._4_4_ * auVar106._4_4_;
        auVar108._0_4_ = -auVar125._0_4_ * auVar106._0_4_;
        auVar108._8_4_ = -auVar125._8_4_ * auVar106._8_4_;
        auVar108._12_4_ = -auVar125._12_4_ * auVar106._12_4_;
        auVar108._16_4_ = -auVar125._16_4_ * auVar106._16_4_;
        auVar108._20_4_ = -auVar125._20_4_ * auVar106._20_4_;
        auVar108._24_4_ = -auVar125._24_4_ * auVar106._24_4_;
        auVar108._28_4_ = auVar125._28_4_ ^ 0x80000000;
        auVar123 = vmulps_avx512vl(auVar106,auVar112);
        auVar98 = vfmadd213ps_fma(auVar119,auVar114,auVar109);
        auVar97 = vfmadd213ps_fma(auVar118,auVar114,auVar110);
        auVar106 = vfmadd213ps_avx512vl(auVar121,auVar114,auVar120);
        auVar107 = vfmadd213ps_avx512vl(auVar117,ZEXT1632(auVar23),ZEXT1632(auVar21));
        auVar100 = vfnmadd213ps_fma(auVar119,auVar114,auVar109);
        auVar109 = ZEXT1632(auVar23);
        auVar99 = vfmadd213ps_fma(auVar108,auVar109,ZEXT1632(auVar22));
        auVar101 = vfnmadd213ps_fma(auVar118,auVar114,auVar110);
        auVar103 = vfmadd213ps_fma(auVar123,auVar109,auVar116);
        auVar119 = vfnmadd231ps_avx512vl(auVar120,auVar114,auVar121);
        auVar21 = vfnmadd213ps_fma(auVar117,auVar109,ZEXT1632(auVar21));
        auVar22 = vfnmadd213ps_fma(auVar108,auVar109,ZEXT1632(auVar22));
        auVar28 = vfnmadd231ps_fma(auVar116,ZEXT1632(auVar23),auVar123);
        auVar123 = vsubps_avx512vl(auVar107,ZEXT1632(auVar100));
        auVar121 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar101));
        auVar118 = vsubps_avx512vl(ZEXT1632(auVar103),auVar119);
        auVar117 = vmulps_avx512vl(auVar121,auVar119);
        auVar234 = vfmsub231ps_fma(auVar117,ZEXT1632(auVar101),auVar118);
        auVar109._4_4_ = auVar100._4_4_ * auVar118._4_4_;
        auVar109._0_4_ = auVar100._0_4_ * auVar118._0_4_;
        auVar109._8_4_ = auVar100._8_4_ * auVar118._8_4_;
        auVar109._12_4_ = auVar100._12_4_ * auVar118._12_4_;
        auVar109._16_4_ = auVar118._16_4_ * 0.0;
        auVar109._20_4_ = auVar118._20_4_ * 0.0;
        auVar109._24_4_ = auVar118._24_4_ * 0.0;
        auVar109._28_4_ = auVar118._28_4_;
        auVar118 = vfmsub231ps_avx512vl(auVar109,auVar119,auVar123);
        auVar110._4_4_ = auVar101._4_4_ * auVar123._4_4_;
        auVar110._0_4_ = auVar101._0_4_ * auVar123._0_4_;
        auVar110._8_4_ = auVar101._8_4_ * auVar123._8_4_;
        auVar110._12_4_ = auVar101._12_4_ * auVar123._12_4_;
        auVar110._16_4_ = auVar123._16_4_ * 0.0;
        auVar110._20_4_ = auVar123._20_4_ * 0.0;
        auVar110._24_4_ = auVar123._24_4_ * 0.0;
        auVar110._28_4_ = auVar123._28_4_;
        auVar20 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar100),auVar121);
        auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar112,auVar118);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar112,ZEXT1632(auVar234));
        auVar122 = ZEXT1632(auVar102);
        uVar83 = vcmpps_avx512vl(auVar121,auVar122,2);
        bVar82 = (byte)uVar83;
        fVar92 = (float)((uint)(bVar82 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar21._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar145 = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar21._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar147 = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar21._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar149 = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar21._12_4_);
        auVar117 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar147,CONCAT44(fVar145,fVar92))));
        fVar93 = (float)((uint)(bVar82 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar22._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar146 = (float)((uint)bVar13 * auVar97._4_4_ | (uint)!bVar13 * auVar22._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar148 = (float)((uint)bVar13 * auVar97._8_4_ | (uint)!bVar13 * auVar22._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar150 = (float)((uint)bVar13 * auVar97._12_4_ | (uint)!bVar13 * auVar22._12_4_);
        auVar108 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar148,CONCAT44(fVar146,fVar93))));
        auVar120._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar28._0_4_
                    );
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar28._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar28._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar28._12_4_);
        fVar202 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar106._16_4_);
        auVar120._16_4_ = fVar202;
        fVar186 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar106._20_4_);
        auVar120._20_4_ = fVar186;
        fVar204 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar106._24_4_);
        auVar120._24_4_ = fVar204;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar106._28_4_;
        auVar120._28_4_ = iVar1;
        auVar123 = vblendmps_avx512vl(ZEXT1632(auVar100),auVar107);
        auVar127._0_4_ =
             (uint)(bVar82 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar234._0_4_;
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar234._4_4_;
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar234._8_4_;
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar234._12_4_;
        auVar127._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar123._16_4_;
        auVar127._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar123._20_4_;
        auVar127._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar123._24_4_;
        auVar127._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar123._28_4_;
        auVar123 = vblendmps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar99));
        auVar128._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar97._0_4_
                    );
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar97._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar97._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar97._12_4_);
        fVar205 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar123._16_4_);
        auVar128._16_4_ = fVar205;
        fVar181 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar123._20_4_);
        auVar128._20_4_ = fVar181;
        fVar185 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar123._24_4_);
        auVar128._24_4_ = fVar185;
        auVar128._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar123._28_4_;
        auVar123 = vblendmps_avx512vl(auVar119,ZEXT1632(auVar103));
        auVar129._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar106._0_4_);
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar13 * auVar123._4_4_ | (uint)!bVar13 * auVar106._4_4_);
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar13 * auVar123._8_4_ | (uint)!bVar13 * auVar106._8_4_);
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar13 * auVar123._12_4_ | (uint)!bVar13 * auVar106._12_4_);
        bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar13 * auVar123._16_4_ | (uint)!bVar13 * auVar106._16_4_);
        bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar13 * auVar123._20_4_ | (uint)!bVar13 * auVar106._20_4_);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar13 * auVar123._24_4_ | (uint)!bVar13 * auVar106._24_4_);
        bVar13 = SUB81(uVar83 >> 7,0);
        auVar129._28_4_ = (uint)bVar13 * auVar123._28_4_ | (uint)!bVar13 * auVar106._28_4_;
        auVar130._0_4_ =
             (uint)(bVar82 & 1) * (int)auVar100._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar107._0_4_;
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar13 * (int)auVar100._4_4_ | (uint)!bVar13 * auVar107._4_4_;
        bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar13 * (int)auVar100._8_4_ | (uint)!bVar13 * auVar107._8_4_;
        bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar13 * (int)auVar100._12_4_ | (uint)!bVar13 * auVar107._12_4_;
        auVar130._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar107._16_4_;
        auVar130._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar107._20_4_;
        auVar130._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar107._24_4_;
        auVar130._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar107._28_4_;
        bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar131._0_4_ =
             (uint)(bVar82 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar103._0_4_;
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar103._4_4_;
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar103._8_4_;
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar103._12_4_;
        auVar131._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar119._16_4_;
        auVar131._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar119._20_4_;
        auVar131._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar119._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar119._28_4_;
        auVar131._28_4_ = iVar2;
        auVar109 = vsubps_avx512vl(auVar130,auVar117);
        auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar101._12_4_ |
                                                 (uint)!bVar16 * auVar99._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar101._8_4_ |
                                                          (uint)!bVar15 * auVar99._8_4_,
                                                          CONCAT44((uint)bVar13 *
                                                                   (int)auVar101._4_4_ |
                                                                   (uint)!bVar13 * auVar99._4_4_,
                                                                   (uint)(bVar82 & 1) *
                                                                   (int)auVar101._0_4_ |
                                                                   (uint)!(bool)(bVar82 & 1) *
                                                                   auVar99._0_4_)))),auVar108);
        auVar119 = vsubps_avx(auVar131,auVar120);
        auVar118 = vsubps_avx(auVar117,auVar127);
        auVar106 = vsubps_avx(auVar108,auVar128);
        auVar107 = vsubps_avx(auVar120,auVar129);
        auVar112._4_4_ = auVar119._4_4_ * fVar145;
        auVar112._0_4_ = auVar119._0_4_ * fVar92;
        auVar112._8_4_ = auVar119._8_4_ * fVar147;
        auVar112._12_4_ = auVar119._12_4_ * fVar149;
        auVar112._16_4_ = auVar119._16_4_ * 0.0;
        auVar112._20_4_ = auVar119._20_4_ * 0.0;
        auVar112._24_4_ = auVar119._24_4_ * 0.0;
        auVar112._28_4_ = iVar2;
        auVar98 = vfmsub231ps_fma(auVar112,auVar120,auVar109);
        auVar113._4_4_ = fVar146 * auVar109._4_4_;
        auVar113._0_4_ = fVar93 * auVar109._0_4_;
        auVar113._8_4_ = fVar148 * auVar109._8_4_;
        auVar113._12_4_ = fVar150 * auVar109._12_4_;
        auVar113._16_4_ = auVar109._16_4_ * 0.0;
        auVar113._20_4_ = auVar109._20_4_ * 0.0;
        auVar113._24_4_ = auVar109._24_4_ * 0.0;
        auVar113._28_4_ = auVar121._28_4_;
        auVar97 = vfmsub231ps_fma(auVar113,auVar117,auVar123);
        auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar122,ZEXT1632(auVar98));
        auVar198._0_4_ = auVar123._0_4_ * auVar120._0_4_;
        auVar198._4_4_ = auVar123._4_4_ * auVar120._4_4_;
        auVar198._8_4_ = auVar123._8_4_ * auVar120._8_4_;
        auVar198._12_4_ = auVar123._12_4_ * auVar120._12_4_;
        auVar198._16_4_ = auVar123._16_4_ * fVar202;
        auVar198._20_4_ = auVar123._20_4_ * fVar186;
        auVar198._24_4_ = auVar123._24_4_ * fVar204;
        auVar198._28_4_ = 0;
        auVar98 = vfmsub231ps_fma(auVar198,auVar108,auVar119);
        auVar110 = vfmadd231ps_avx512vl(auVar121,auVar122,ZEXT1632(auVar98));
        auVar121 = vmulps_avx512vl(auVar107,auVar127);
        auVar121 = vfmsub231ps_avx512vl(auVar121,auVar118,auVar129);
        auVar116._4_4_ = auVar106._4_4_ * auVar129._4_4_;
        auVar116._0_4_ = auVar106._0_4_ * auVar129._0_4_;
        auVar116._8_4_ = auVar106._8_4_ * auVar129._8_4_;
        auVar116._12_4_ = auVar106._12_4_ * auVar129._12_4_;
        auVar116._16_4_ = auVar106._16_4_ * auVar129._16_4_;
        auVar116._20_4_ = auVar106._20_4_ * auVar129._20_4_;
        auVar116._24_4_ = auVar106._24_4_ * auVar129._24_4_;
        auVar116._28_4_ = auVar129._28_4_;
        auVar98 = vfmsub231ps_fma(auVar116,auVar128,auVar107);
        auVar199._0_4_ = auVar128._0_4_ * auVar118._0_4_;
        auVar199._4_4_ = auVar128._4_4_ * auVar118._4_4_;
        auVar199._8_4_ = auVar128._8_4_ * auVar118._8_4_;
        auVar199._12_4_ = auVar128._12_4_ * auVar118._12_4_;
        auVar199._16_4_ = fVar205 * auVar118._16_4_;
        auVar199._20_4_ = fVar181 * auVar118._20_4_;
        auVar199._24_4_ = fVar185 * auVar118._24_4_;
        auVar199._28_4_ = 0;
        auVar97 = vfmsub231ps_fma(auVar199,auVar106,auVar127);
        auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),auVar122,auVar121);
        auVar112 = vfmadd231ps_avx512vl(auVar121,auVar122,ZEXT1632(auVar98));
        auVar121 = vmaxps_avx(auVar110,auVar112);
        uVar153 = vcmpps_avx512vl(auVar121,auVar122,2);
        bVar90 = bVar90 & (byte)uVar153;
        auVar231 = ZEXT3264(local_420);
        auVar232 = ZEXT3264(local_400);
        auVar233 = ZEXT3264(local_440);
        auVar229 = ZEXT3264(local_640);
        auVar225 = ZEXT1664(_local_610);
        if (bVar90 == 0) {
          bVar90 = 0;
        }
        else {
          auVar45._4_4_ = auVar107._4_4_ * auVar123._4_4_;
          auVar45._0_4_ = auVar107._0_4_ * auVar123._0_4_;
          auVar45._8_4_ = auVar107._8_4_ * auVar123._8_4_;
          auVar45._12_4_ = auVar107._12_4_ * auVar123._12_4_;
          auVar45._16_4_ = auVar107._16_4_ * auVar123._16_4_;
          auVar45._20_4_ = auVar107._20_4_ * auVar123._20_4_;
          auVar45._24_4_ = auVar107._24_4_ * auVar123._24_4_;
          auVar45._28_4_ = auVar121._28_4_;
          auVar99 = vfmsub231ps_fma(auVar45,auVar106,auVar119);
          auVar46._4_4_ = auVar119._4_4_ * auVar118._4_4_;
          auVar46._0_4_ = auVar119._0_4_ * auVar118._0_4_;
          auVar46._8_4_ = auVar119._8_4_ * auVar118._8_4_;
          auVar46._12_4_ = auVar119._12_4_ * auVar118._12_4_;
          auVar46._16_4_ = auVar119._16_4_ * auVar118._16_4_;
          auVar46._20_4_ = auVar119._20_4_ * auVar118._20_4_;
          auVar46._24_4_ = auVar119._24_4_ * auVar118._24_4_;
          auVar46._28_4_ = auVar119._28_4_;
          auVar97 = vfmsub231ps_fma(auVar46,auVar109,auVar107);
          auVar47._4_4_ = auVar106._4_4_ * auVar109._4_4_;
          auVar47._0_4_ = auVar106._0_4_ * auVar109._0_4_;
          auVar47._8_4_ = auVar106._8_4_ * auVar109._8_4_;
          auVar47._12_4_ = auVar106._12_4_ * auVar109._12_4_;
          auVar47._16_4_ = auVar106._16_4_ * auVar109._16_4_;
          auVar47._20_4_ = auVar106._20_4_ * auVar109._20_4_;
          auVar47._24_4_ = auVar106._24_4_ * auVar109._24_4_;
          auVar47._28_4_ = auVar106._28_4_;
          auVar103 = vfmsub231ps_fma(auVar47,auVar118,auVar123);
          auVar98 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar97),ZEXT1632(auVar103));
          auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar99),auVar122);
          auVar123 = vrcp14ps_avx512vl(auVar121);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = &DAT_3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar36._16_4_ = 0x3f800000;
          auVar36._20_4_ = 0x3f800000;
          auVar36._24_4_ = 0x3f800000;
          auVar36._28_4_ = 0x3f800000;
          auVar119 = vfnmadd213ps_avx512vl(auVar123,auVar121,auVar36);
          auVar98 = vfmadd132ps_fma(auVar119,auVar123,auVar123);
          auVar48._4_4_ = auVar103._4_4_ * auVar120._4_4_;
          auVar48._0_4_ = auVar103._0_4_ * auVar120._0_4_;
          auVar48._8_4_ = auVar103._8_4_ * auVar120._8_4_;
          auVar48._12_4_ = auVar103._12_4_ * auVar120._12_4_;
          auVar48._16_4_ = fVar202 * 0.0;
          auVar48._20_4_ = fVar186 * 0.0;
          auVar48._24_4_ = fVar204 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar97 = vfmadd231ps_fma(auVar48,auVar108,ZEXT1632(auVar97));
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar117,ZEXT1632(auVar99));
          fVar186 = auVar98._0_4_;
          fVar202 = auVar98._4_4_;
          fVar204 = auVar98._8_4_;
          fVar205 = auVar98._12_4_;
          auVar123 = ZEXT1632(CONCAT412(auVar97._12_4_ * fVar205,
                                        CONCAT48(auVar97._8_4_ * fVar204,
                                                 CONCAT44(auVar97._4_4_ * fVar202,
                                                          auVar97._0_4_ * fVar186))));
          auVar215._4_4_ = fVar187;
          auVar215._0_4_ = fVar187;
          auVar215._8_4_ = fVar187;
          auVar215._12_4_ = fVar187;
          auVar215._16_4_ = fVar187;
          auVar215._20_4_ = fVar187;
          auVar215._24_4_ = fVar187;
          auVar215._28_4_ = fVar187;
          uVar153 = vcmpps_avx512vl(auVar215,auVar123,2);
          uVar152 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar37._4_4_ = uVar152;
          auVar37._0_4_ = uVar152;
          auVar37._8_4_ = uVar152;
          auVar37._12_4_ = uVar152;
          auVar37._16_4_ = uVar152;
          auVar37._20_4_ = uVar152;
          auVar37._24_4_ = uVar152;
          auVar37._28_4_ = uVar152;
          uVar24 = vcmpps_avx512vl(auVar123,auVar37,2);
          bVar90 = (byte)uVar153 & (byte)uVar24 & bVar90;
          if (bVar90 != 0) {
            uVar153 = vcmpps_avx512vl(auVar121,auVar122,4);
            if ((bVar90 & (byte)uVar153) != 0) {
              bVar90 = bVar90 & (byte)uVar153;
              fVar181 = auVar110._0_4_ * fVar186;
              fVar185 = auVar110._4_4_ * fVar202;
              auVar49._4_4_ = fVar185;
              auVar49._0_4_ = fVar181;
              fVar92 = auVar110._8_4_ * fVar204;
              auVar49._8_4_ = fVar92;
              fVar93 = auVar110._12_4_ * fVar205;
              auVar49._12_4_ = fVar93;
              fVar145 = auVar110._16_4_ * 0.0;
              auVar49._16_4_ = fVar145;
              fVar146 = auVar110._20_4_ * 0.0;
              auVar49._20_4_ = fVar146;
              fVar147 = auVar110._24_4_ * 0.0;
              auVar49._24_4_ = fVar147;
              auVar49._28_4_ = auVar110._28_4_;
              fVar186 = auVar112._0_4_ * fVar186;
              fVar202 = auVar112._4_4_ * fVar202;
              auVar50._4_4_ = fVar202;
              auVar50._0_4_ = fVar186;
              fVar204 = auVar112._8_4_ * fVar204;
              auVar50._8_4_ = fVar204;
              fVar205 = auVar112._12_4_ * fVar205;
              auVar50._12_4_ = fVar205;
              fVar148 = auVar112._16_4_ * 0.0;
              auVar50._16_4_ = fVar148;
              fVar149 = auVar112._20_4_ * 0.0;
              auVar50._20_4_ = fVar149;
              fVar150 = auVar112._24_4_ * 0.0;
              auVar50._24_4_ = fVar150;
              auVar50._28_4_ = auVar112._28_4_;
              auVar209._8_4_ = 0x3f800000;
              auVar209._0_8_ = &DAT_3f8000003f800000;
              auVar209._12_4_ = 0x3f800000;
              auVar209._16_4_ = 0x3f800000;
              auVar209._20_4_ = 0x3f800000;
              auVar209._24_4_ = 0x3f800000;
              auVar209._28_4_ = 0x3f800000;
              auVar121 = vsubps_avx(auVar209,auVar49);
              local_560._0_4_ =
                   (uint)(bVar82 & 1) * (int)fVar181 | (uint)!(bool)(bVar82 & 1) * auVar121._0_4_;
              bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
              local_560._4_4_ = (uint)bVar13 * (int)fVar185 | (uint)!bVar13 * auVar121._4_4_;
              bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
              local_560._8_4_ = (uint)bVar13 * (int)fVar92 | (uint)!bVar13 * auVar121._8_4_;
              bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
              local_560._12_4_ = (uint)bVar13 * (int)fVar93 | (uint)!bVar13 * auVar121._12_4_;
              bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
              local_560._16_4_ = (uint)bVar13 * (int)fVar145 | (uint)!bVar13 * auVar121._16_4_;
              bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
              local_560._20_4_ = (uint)bVar13 * (int)fVar146 | (uint)!bVar13 * auVar121._20_4_;
              bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
              local_560._24_4_ = (uint)bVar13 * (int)fVar147 | (uint)!bVar13 * auVar121._24_4_;
              bVar13 = SUB81(uVar83 >> 7,0);
              local_560._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar121._28_4_;
              auVar121 = vsubps_avx(auVar209,auVar50);
              bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
              bVar19 = SUB81(uVar83 >> 7,0);
              local_1a0._4_4_ = (uint)bVar13 * (int)fVar202 | (uint)!bVar13 * auVar121._4_4_;
              local_1a0._0_4_ =
                   (uint)(bVar82 & 1) * (int)fVar186 | (uint)!(bool)(bVar82 & 1) * auVar121._0_4_;
              local_1a0._8_4_ = (uint)bVar14 * (int)fVar204 | (uint)!bVar14 * auVar121._8_4_;
              local_1a0._12_4_ = (uint)bVar15 * (int)fVar205 | (uint)!bVar15 * auVar121._12_4_;
              local_1a0._16_4_ = (uint)bVar16 * (int)fVar148 | (uint)!bVar16 * auVar121._16_4_;
              local_1a0._20_4_ = (uint)bVar17 * (int)fVar149 | (uint)!bVar17 * auVar121._20_4_;
              local_1a0._24_4_ = (uint)bVar18 * (int)fVar150 | (uint)!bVar18 * auVar121._24_4_;
              local_1a0._28_4_ = (uint)bVar19 * auVar112._28_4_ | (uint)!bVar19 * auVar121._28_4_;
              local_580 = auVar123;
              goto LAB_01c48af1;
            }
          }
          bVar90 = 0;
        }
LAB_01c48af1:
        auVar238 = ZEXT3264(local_540);
        auVar237 = ZEXT3264(local_520);
        auVar236 = ZEXT3264(local_500);
        auVar230 = ZEXT3264(auVar111);
        if (bVar90 != 0) {
          auVar121 = vsubps_avx(ZEXT1632(auVar23),auVar114);
          auVar98 = vfmadd213ps_fma(auVar121,local_560,auVar114);
          uVar152 = *(undefined4 *)((long)local_6b8->ray_space + k * 4 + -0x10);
          auVar114._4_4_ = uVar152;
          auVar114._0_4_ = uVar152;
          auVar114._8_4_ = uVar152;
          auVar114._12_4_ = uVar152;
          auVar114._16_4_ = uVar152;
          auVar114._20_4_ = uVar152;
          auVar114._24_4_ = uVar152;
          auVar114._28_4_ = uVar152;
          auVar121 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar98._12_4_ + auVar98._12_4_,
                                                        CONCAT48(auVar98._8_4_ + auVar98._8_4_,
                                                                 CONCAT44(auVar98._4_4_ +
                                                                          auVar98._4_4_,
                                                                          auVar98._0_4_ +
                                                                          auVar98._0_4_)))),auVar114
                                    );
          uVar153 = vcmpps_avx512vl(local_580,auVar121,6);
          bVar90 = bVar90 & (byte)uVar153;
          if (bVar90 != 0) {
            auVar162._8_4_ = 0xbf800000;
            auVar162._0_8_ = 0xbf800000bf800000;
            auVar162._12_4_ = 0xbf800000;
            auVar162._16_4_ = 0xbf800000;
            auVar162._20_4_ = 0xbf800000;
            auVar162._24_4_ = 0xbf800000;
            auVar162._28_4_ = 0xbf800000;
            auVar38._8_4_ = 0x40000000;
            auVar38._0_8_ = 0x4000000040000000;
            auVar38._12_4_ = 0x40000000;
            auVar38._16_4_ = 0x40000000;
            auVar38._20_4_ = 0x40000000;
            auVar38._24_4_ = 0x40000000;
            auVar38._28_4_ = 0x40000000;
            local_360 = vfmadd132ps_avx512vl(local_1a0,auVar162,auVar38);
            local_1a0 = local_360;
            auVar121 = local_1a0;
            local_320 = 0;
            local_310 = local_6b0._0_8_;
            uStack_308 = local_6b0._8_8_;
            local_300 = local_5d0._0_8_;
            uStack_2f8 = local_5d0._8_8_;
            local_2f0 = local_5e0._0_8_;
            uStack_2e8 = local_5e0._8_8_;
            local_2e0 = local_5f0;
            uStack_2d8 = uStack_5e8;
            local_1a0 = auVar121;
            if ((pGVar87->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar186 = 1.0 / auVar115._0_4_;
              local_2c0[0] = fVar186 * (local_560._0_4_ + 0.0);
              local_2c0[1] = fVar186 * (local_560._4_4_ + 1.0);
              local_2c0[2] = fVar186 * (local_560._8_4_ + 2.0);
              local_2c0[3] = fVar186 * (local_560._12_4_ + 3.0);
              fStack_2b0 = fVar186 * (local_560._16_4_ + 4.0);
              fStack_2ac = fVar186 * (local_560._20_4_ + 5.0);
              fStack_2a8 = fVar186 * (local_560._24_4_ + 6.0);
              fStack_2a4 = local_560._28_4_ + 7.0;
              local_1a0._0_8_ = local_360._0_8_;
              local_1a0._8_8_ = local_360._8_8_;
              local_1a0._16_8_ = local_360._16_8_;
              local_1a0._24_8_ = local_360._24_8_;
              local_2a0 = local_1a0._0_8_;
              uStack_298 = local_1a0._8_8_;
              uStack_290 = local_1a0._16_8_;
              uStack_288 = local_1a0._24_8_;
              local_280 = local_580;
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar121 = vblendmps_avx512vl(auVar163,local_580);
              auVar132._0_4_ =
                   (uint)(bVar90 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 1 & 1);
              auVar132._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 2 & 1);
              auVar132._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 3 & 1);
              auVar132._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 4 & 1);
              auVar132._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 5 & 1);
              auVar132._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 6 & 1);
              auVar132._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar132._28_4_ =
                   (uint)(bVar90 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
              auVar121 = vshufps_avx(auVar132,auVar132,0xb1);
              auVar121 = vminps_avx(auVar132,auVar121);
              auVar123 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar123);
              auVar123 = vpermpd_avx2(auVar121,0x4e);
              auVar121 = vminps_avx(auVar121,auVar123);
              uVar153 = vcmpps_avx512vl(auVar132,auVar121,0);
              bVar81 = (byte)uVar153 & bVar90;
              bVar82 = bVar90;
              if (bVar81 != 0) {
                bVar82 = bVar81;
              }
              uVar25 = 0;
              for (uVar84 = (uint)bVar82; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                uVar25 = uVar25 + 1;
              }
              uVar83 = (ulong)uVar25;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar87->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar186 = local_2c0[uVar83];
                uVar152 = *(undefined4 *)((long)&local_2a0 + uVar83 * 4);
                fVar202 = 1.0 - fVar186;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar99 = vxorps_avx512vl(ZEXT416((uint)fVar202),auVar31);
                auVar98 = ZEXT416((uint)(fVar186 * fVar202 * 4.0));
                auVar97 = vfnmsub213ss_fma(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),auVar98);
                auVar98 = vfmadd213ss_fma(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),auVar98);
                fVar202 = fVar202 * auVar99._0_4_ * 0.5;
                fVar204 = auVar97._0_4_ * 0.5;
                fVar205 = auVar98._0_4_ * 0.5;
                fVar181 = fVar186 * fVar186 * 0.5;
                auVar190._0_4_ = fVar181 * (float)local_5f0._0_4_;
                auVar190._4_4_ = fVar181 * (float)local_5f0._4_4_;
                auVar190._8_4_ = fVar181 * (float)uStack_5e8;
                auVar190._12_4_ = fVar181 * uStack_5e8._4_4_;
                auVar177._4_4_ = fVar205;
                auVar177._0_4_ = fVar205;
                auVar177._8_4_ = fVar205;
                auVar177._12_4_ = fVar205;
                auVar98 = vfmadd132ps_fma(auVar177,auVar190,local_5e0);
                auVar191._4_4_ = fVar204;
                auVar191._0_4_ = fVar204;
                auVar191._8_4_ = fVar204;
                auVar191._12_4_ = fVar204;
                auVar98 = vfmadd132ps_fma(auVar191,auVar98,local_5d0);
                auVar178._4_4_ = fVar202;
                auVar178._0_4_ = fVar202;
                auVar178._8_4_ = fVar202;
                auVar178._12_4_ = fVar202;
                auVar98 = vfmadd132ps_fma(auVar178,auVar98,local_6b0);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar83 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar98._0_4_;
                uVar9 = vextractps_avx(auVar98,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                uVar9 = vextractps_avx(auVar98,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar9;
                *(float *)(ray + k * 4 + 0xf0) = fVar186;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar152;
                *(uint *)(ray + k * 4 + 0x110) = uVar7;
                *(uint *)(ray + k * 4 + 0x120) = uVar88;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_4b0 = vpbroadcastd_avx512vl();
                local_600 = vpbroadcastd_avx512vl();
                local_4c0 = local_5d0._0_4_;
                uStack_4bc = local_5d0._4_4_;
                uStack_4b8 = local_5d0._8_8_;
                local_4d0 = local_5e0._0_8_;
                uStack_4c8 = local_5e0._8_8_;
                local_4e0 = (float)local_5f0._0_4_;
                fStack_4dc = (float)local_5f0._4_4_;
                fStack_4d8 = (float)uStack_5e8;
                fStack_4d4 = uStack_5e8._4_4_;
                local_480 = fVar187;
                local_460 = auVar111;
                local_380 = local_560;
                local_340 = local_580;
                local_31c = iVar8;
                local_2d0 = bVar90;
                do {
                  auVar103 = auVar235._0_16_;
                  local_4a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar203 = local_2c0[uVar83];
                  local_220._4_4_ = fVar203;
                  local_220._0_4_ = fVar203;
                  local_220._8_4_ = fVar203;
                  local_220._12_4_ = fVar203;
                  local_210 = *(undefined4 *)((long)&local_2a0 + uVar83 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar83 * 4);
                  local_698.context = context->user;
                  fVar186 = 1.0 - fVar203;
                  auVar35._8_4_ = 0x80000000;
                  auVar35._0_8_ = 0x8000000080000000;
                  auVar35._12_4_ = 0x80000000;
                  auVar99 = vxorps_avx512vl(ZEXT416((uint)fVar186),auVar35);
                  auVar98 = ZEXT416((uint)(fVar203 * fVar186 * 4.0));
                  auVar97 = vfnmsub213ss_fma(local_220,local_220,auVar98);
                  auVar98 = vfmadd213ss_fma(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),auVar98);
                  fVar186 = fVar186 * auVar99._0_4_ * 0.5;
                  fVar202 = auVar97._0_4_ * 0.5;
                  fVar204 = auVar98._0_4_ * 0.5;
                  fVar203 = fVar203 * fVar203 * 0.5;
                  auVar196._0_4_ = fVar203 * local_4e0;
                  auVar196._4_4_ = fVar203 * fStack_4dc;
                  auVar196._8_4_ = fVar203 * fStack_4d8;
                  auVar196._12_4_ = fVar203 * fStack_4d4;
                  auVar160._4_4_ = fVar204;
                  auVar160._0_4_ = fVar204;
                  auVar160._8_4_ = fVar204;
                  auVar160._12_4_ = fVar204;
                  auVar77._8_8_ = uStack_4c8;
                  auVar77._0_8_ = local_4d0;
                  auVar98 = vfmadd132ps_fma(auVar160,auVar196,auVar77);
                  auVar197._4_4_ = fVar202;
                  auVar197._0_4_ = fVar202;
                  auVar197._8_4_ = fVar202;
                  auVar197._12_4_ = fVar202;
                  auVar78._4_4_ = uStack_4bc;
                  auVar78._0_4_ = local_4c0;
                  auVar78._8_8_ = uStack_4b8;
                  auVar98 = vfmadd132ps_fma(auVar197,auVar98,auVar78);
                  auVar161._4_4_ = fVar186;
                  auVar161._0_4_ = fVar186;
                  auVar161._8_4_ = fVar186;
                  auVar161._12_4_ = fVar186;
                  auVar98 = vfmadd132ps_fma(auVar161,auVar98,local_6b0);
                  local_250 = auVar98._0_4_;
                  local_240 = vshufps_avx(auVar98,auVar98,0x55);
                  local_230 = vshufps_avx(auVar98,auVar98,0xaa);
                  iStack_24c = local_250;
                  iStack_248 = local_250;
                  iStack_244 = local_250;
                  uStack_20c = local_210;
                  uStack_208 = local_210;
                  uStack_204 = local_210;
                  local_200 = local_600._0_8_;
                  uStack_1f8 = local_600._8_8_;
                  local_1f0 = local_4b0;
                  vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                  uStack_1dc = (local_698.context)->instID[0];
                  local_1e0 = uStack_1dc;
                  uStack_1d8 = uStack_1dc;
                  uStack_1d4 = uStack_1dc;
                  uStack_1d0 = (local_698.context)->instPrimID[0];
                  uStack_1cc = uStack_1d0;
                  uStack_1c8 = uStack_1d0;
                  uStack_1c4 = uStack_1d0;
                  local_6d0 = local_3d0._0_8_;
                  uStack_6c8 = local_3d0._8_8_;
                  local_698.valid = (int *)&local_6d0;
                  local_698.geometryUserPtr = pGVar87->userPtr;
                  local_698.hit = (RTCHitN *)&local_250;
                  local_698.N = 4;
                  local_3c0 = (undefined4)uVar83;
                  uStack_3bc = (undefined4)(uVar83 >> 0x20);
                  local_698.ray = (RTCRayN *)ray;
                  if (pGVar87->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar87->intersectionFilterN)(&local_698);
                    uVar83 = CONCAT44(uStack_3bc,local_3c0);
                    auVar225 = ZEXT1664(_local_610);
                    auVar230 = ZEXT3264(local_460);
                    auVar238 = ZEXT3264(local_540);
                    auVar237 = ZEXT3264(local_520);
                    auVar236 = ZEXT3264(local_500);
                    auVar239 = ZEXT3264(local_660);
                    auVar229 = ZEXT3264(local_640);
                    auVar233 = ZEXT3264(local_440);
                    auVar232 = ZEXT3264(local_400);
                    auVar231 = ZEXT3264(local_420);
                    auVar98 = vxorps_avx512vl(auVar103,auVar103);
                    auVar235 = ZEXT1664(auVar98);
                    fVar187 = local_480;
                  }
                  auVar98 = auVar235._0_16_;
                  auVar73._8_8_ = uStack_6c8;
                  auVar73._0_8_ = local_6d0;
                  uVar91 = vptestmd_avx512vl(auVar73,auVar73);
                  if ((uVar91 & 0xf) == 0) {
LAB_01c4a14c:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_4a0._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar87->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_698);
                      uVar83 = CONCAT44(uStack_3bc,local_3c0);
                      auVar225 = ZEXT1664(_local_610);
                      auVar230 = ZEXT3264(local_460);
                      auVar238 = ZEXT3264(local_540);
                      auVar237 = ZEXT3264(local_520);
                      auVar236 = ZEXT3264(local_500);
                      auVar239 = ZEXT3264(local_660);
                      auVar229 = ZEXT3264(local_640);
                      auVar233 = ZEXT3264(local_440);
                      auVar232 = ZEXT3264(local_400);
                      auVar231 = ZEXT3264(local_420);
                      auVar98 = vxorps_avx512vl(auVar98,auVar98);
                      auVar235 = ZEXT1664(auVar98);
                      fVar187 = local_480;
                    }
                    auVar74._8_8_ = uStack_6c8;
                    auVar74._0_8_ = local_6d0;
                    uVar91 = vptestmd_avx512vl(auVar74,auVar74);
                    uVar91 = uVar91 & 0xf;
                    bVar82 = (byte)uVar91;
                    if (bVar82 == 0) goto LAB_01c4a14c;
                    iVar1 = *(int *)(local_698.hit + 4);
                    iVar2 = *(int *)(local_698.hit + 8);
                    iVar70 = *(int *)(local_698.hit + 0xc);
                    bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                    bVar15 = SUB81(uVar91 >> 3,0);
                    *(uint *)(local_698.ray + 0xc0) =
                         (uint)(bVar82 & 1) * *(int *)local_698.hit |
                         (uint)!(bool)(bVar82 & 1) * *(int *)(local_698.ray + 0xc0);
                    *(uint *)(local_698.ray + 0xc4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_698.ray + 0xc4);
                    *(uint *)(local_698.ray + 200) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_698.ray + 200);
                    *(uint *)(local_698.ray + 0xcc) =
                         (uint)bVar15 * iVar70 | (uint)!bVar15 * *(int *)(local_698.ray + 0xcc);
                    iVar1 = *(int *)(local_698.hit + 0x14);
                    iVar2 = *(int *)(local_698.hit + 0x18);
                    iVar70 = *(int *)(local_698.hit + 0x1c);
                    bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                    bVar15 = SUB81(uVar91 >> 3,0);
                    *(uint *)(local_698.ray + 0xd0) =
                         (uint)(bVar82 & 1) * *(int *)(local_698.hit + 0x10) |
                         (uint)!(bool)(bVar82 & 1) * *(int *)(local_698.ray + 0xd0);
                    *(uint *)(local_698.ray + 0xd4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_698.ray + 0xd4);
                    *(uint *)(local_698.ray + 0xd8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_698.ray + 0xd8);
                    *(uint *)(local_698.ray + 0xdc) =
                         (uint)bVar15 * iVar70 | (uint)!bVar15 * *(int *)(local_698.ray + 0xdc);
                    iVar1 = *(int *)(local_698.hit + 0x24);
                    iVar2 = *(int *)(local_698.hit + 0x28);
                    iVar70 = *(int *)(local_698.hit + 0x2c);
                    bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                    bVar15 = SUB81(uVar91 >> 3,0);
                    *(uint *)(local_698.ray + 0xe0) =
                         (uint)(bVar82 & 1) * *(int *)(local_698.hit + 0x20) |
                         (uint)!(bool)(bVar82 & 1) * *(int *)(local_698.ray + 0xe0);
                    *(uint *)(local_698.ray + 0xe4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_698.ray + 0xe4);
                    *(uint *)(local_698.ray + 0xe8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_698.ray + 0xe8);
                    *(uint *)(local_698.ray + 0xec) =
                         (uint)bVar15 * iVar70 | (uint)!bVar15 * *(int *)(local_698.ray + 0xec);
                    iVar1 = *(int *)(local_698.hit + 0x34);
                    iVar2 = *(int *)(local_698.hit + 0x38);
                    iVar70 = *(int *)(local_698.hit + 0x3c);
                    bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                    bVar15 = SUB81(uVar91 >> 3,0);
                    *(uint *)(local_698.ray + 0xf0) =
                         (uint)(bVar82 & 1) * *(int *)(local_698.hit + 0x30) |
                         (uint)!(bool)(bVar82 & 1) * *(int *)(local_698.ray + 0xf0);
                    *(uint *)(local_698.ray + 0xf4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_698.ray + 0xf4);
                    *(uint *)(local_698.ray + 0xf8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_698.ray + 0xf8);
                    *(uint *)(local_698.ray + 0xfc) =
                         (uint)bVar15 * iVar70 | (uint)!bVar15 * *(int *)(local_698.ray + 0xfc);
                    auVar98 = *(undefined1 (*) [16])(local_698.ray + 0x100);
                    auVar105._0_4_ =
                         (uint)(bVar82 & 1) * *(int *)(local_698.hit + 0x40) |
                         (uint)!(bool)(bVar82 & 1) * auVar98._0_4_;
                    bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                    auVar105._4_4_ =
                         (uint)bVar13 * *(int *)(local_698.hit + 0x44) |
                         (uint)!bVar13 * auVar98._4_4_;
                    bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                    auVar105._8_4_ =
                         (uint)bVar13 * *(int *)(local_698.hit + 0x48) |
                         (uint)!bVar13 * auVar98._8_4_;
                    bVar13 = SUB81(uVar91 >> 3,0);
                    auVar105._12_4_ =
                         (uint)bVar13 * *(int *)(local_698.hit + 0x4c) |
                         (uint)!bVar13 * auVar98._12_4_;
                    *(undefined1 (*) [16])(local_698.ray + 0x100) = auVar105;
                    auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x50));
                    *(undefined1 (*) [16])(local_698.ray + 0x110) = auVar98;
                    auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x60));
                    *(undefined1 (*) [16])(local_698.ray + 0x120) = auVar98;
                    auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x70));
                    *(undefined1 (*) [16])(local_698.ray + 0x130) = auVar98;
                    auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x80));
                    *(undefined1 (*) [16])(local_698.ray + 0x140) = auVar98;
                  }
                  auVar111 = auVar230._0_32_;
                  bVar82 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & bVar90;
                  uVar152 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar44._4_4_ = uVar152;
                  auVar44._0_4_ = uVar152;
                  auVar44._8_4_ = uVar152;
                  auVar44._12_4_ = uVar152;
                  auVar44._16_4_ = uVar152;
                  auVar44._20_4_ = uVar152;
                  auVar44._24_4_ = uVar152;
                  auVar44._28_4_ = uVar152;
                  uVar153 = vcmpps_avx512vl(local_580,auVar44,2);
                  bVar90 = bVar82 & (byte)uVar153;
                  if ((bVar82 & (byte)uVar153) != 0) {
                    auVar167._8_4_ = 0x7f800000;
                    auVar167._0_8_ = 0x7f8000007f800000;
                    auVar167._12_4_ = 0x7f800000;
                    auVar167._16_4_ = 0x7f800000;
                    auVar167._20_4_ = 0x7f800000;
                    auVar167._24_4_ = 0x7f800000;
                    auVar167._28_4_ = 0x7f800000;
                    auVar121 = vblendmps_avx512vl(auVar167,local_580);
                    auVar144._0_4_ =
                         (uint)(bVar90 & 1) * auVar121._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 1 & 1);
                    auVar144._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 2 & 1);
                    auVar144._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 3 & 1);
                    auVar144._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 4 & 1);
                    auVar144._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 5 & 1);
                    auVar144._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 6 & 1);
                    auVar144._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar144._28_4_ =
                         (uint)(bVar90 >> 7) * auVar121._28_4_ |
                         (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                    auVar121 = vshufps_avx(auVar144,auVar144,0xb1);
                    auVar121 = vminps_avx(auVar144,auVar121);
                    auVar123 = vshufpd_avx(auVar121,auVar121,5);
                    auVar121 = vminps_avx(auVar121,auVar123);
                    auVar123 = vpermpd_avx2(auVar121,0x4e);
                    auVar121 = vminps_avx(auVar121,auVar123);
                    uVar153 = vcmpps_avx512vl(auVar144,auVar121,0);
                    bVar81 = (byte)uVar153 & bVar90;
                    bVar82 = bVar90;
                    if (bVar81 != 0) {
                      bVar82 = bVar81;
                    }
                    uVar25 = 0;
                    for (uVar84 = (uint)bVar82; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000
                        ) {
                      uVar25 = uVar25 + 1;
                    }
                    uVar83 = (ulong)uVar25;
                  }
                  fVar203 = auVar225._0_4_;
                } while (bVar90 != 0);
              }
            }
          }
        }
      }
      local_480 = fVar203;
      if (8 < iVar8) {
        auVar121 = vpbroadcastd_avx512vl();
        auVar225 = ZEXT3264(auVar121);
        fStack_390 = 1.0 / (float)local_3a0._0_4_;
        local_3a0._4_4_ = fStack_390;
        local_3a0._0_4_ = fStack_390;
        fStack_398 = fStack_390;
        fStack_394 = fStack_390;
        local_4a0 = vpbroadcastd_avx512vl();
        local_4b0 = vpbroadcastd_avx512vl();
        lVar85 = 8;
        fStack_47c = local_480;
        fStack_478 = local_480;
        fStack_474 = local_480;
        fStack_470 = local_480;
        fStack_46c = local_480;
        fStack_468 = local_480;
        fStack_464 = local_480;
        local_460 = auVar111;
        local_3c0 = fVar187;
        uStack_3bc = fVar187;
        uStack_3b8 = fVar187;
        uStack_3b4 = fVar187;
        uStack_3b0 = fVar187;
        uStack_3ac = fVar187;
        uStack_3a8 = fVar187;
        uStack_3a4 = fVar187;
        fStack_38c = fStack_390;
        fStack_388 = fStack_390;
        fStack_384 = fStack_390;
        do {
          auVar121 = vpbroadcastd_avx512vl();
          auVar106 = vpor_avx2(auVar121,_DAT_0205a920);
          uVar24 = vpcmpgtd_avx512vl(auVar225._0_32_,auVar106);
          auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar85 * 4 + lVar26);
          auVar123 = *(undefined1 (*) [32])(lVar26 + 0x222bfac + lVar85 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar26 + 0x222c430 + lVar85 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar26 + 0x222c8b4 + lVar85 * 4);
          local_520 = auVar237._0_32_;
          auVar107 = vmulps_avx512vl(local_520,auVar118);
          local_540 = auVar238._0_32_;
          auVar117 = vmulps_avx512vl(local_540,auVar118);
          auVar51._4_4_ = auVar118._4_4_ * (float)local_e0._4_4_;
          auVar51._0_4_ = auVar118._0_4_ * (float)local_e0._0_4_;
          auVar51._8_4_ = auVar118._8_4_ * fStack_d8;
          auVar51._12_4_ = auVar118._12_4_ * fStack_d4;
          auVar51._16_4_ = auVar118._16_4_ * fStack_d0;
          auVar51._20_4_ = auVar118._20_4_ * fStack_cc;
          auVar51._24_4_ = auVar118._24_4_ * fStack_c8;
          auVar51._28_4_ = auVar106._28_4_;
          auVar126 = auVar239._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar107,auVar119,auVar126);
          local_500 = auVar236._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar117,auVar119,local_500);
          auVar117 = vfmadd231ps_avx512vl(auVar51,auVar119,local_c0);
          auVar125 = auVar233._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar123,auVar125);
          auVar122 = auVar229._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar123,auVar122);
          auVar98 = vfmadd231ps_fma(auVar117,auVar123,local_a0);
          auVar124 = auVar231._0_32_;
          auVar110 = vfmadd231ps_avx512vl(auVar106,auVar121,auVar124);
          local_400 = auVar232._0_32_;
          auVar112 = vfmadd231ps_avx512vl(auVar107,auVar121,local_400);
          auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar85 * 4 + lVar26);
          auVar107 = *(undefined1 (*) [32])(lVar26 + 0x222e3cc + lVar85 * 4);
          auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar121,local_80);
          auVar117 = *(undefined1 (*) [32])(lVar26 + 0x222e850 + lVar85 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar26 + 0x222ecd4 + lVar85 * 4);
          auVar111 = vmulps_avx512vl(local_520,auVar108);
          auVar109 = vmulps_avx512vl(local_540,auVar108);
          auVar52._4_4_ = auVar108._4_4_ * (float)local_e0._4_4_;
          auVar52._0_4_ = auVar108._0_4_ * (float)local_e0._0_4_;
          auVar52._8_4_ = auVar108._8_4_ * fStack_d8;
          auVar52._12_4_ = auVar108._12_4_ * fStack_d4;
          auVar52._16_4_ = auVar108._16_4_ * fStack_d0;
          auVar52._20_4_ = auVar108._20_4_ * fStack_cc;
          auVar52._24_4_ = auVar108._24_4_ * fStack_c8;
          auVar52._28_4_ = uStack_c4;
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,auVar126);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar117,local_500);
          auVar113 = vfmadd231ps_avx512vl(auVar52,auVar117,local_c0);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar125);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar122);
          auVar97 = vfmadd231ps_fma(auVar113,auVar107,local_a0);
          auVar113 = vfmadd231ps_avx512vl(auVar111,auVar106,auVar124);
          auVar114 = vfmadd231ps_avx512vl(auVar109,auVar106,local_400);
          auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar106,local_80);
          auVar115 = vmaxps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar97));
          auVar111 = vsubps_avx(auVar113,auVar110);
          auVar109 = vsubps_avx(auVar114,auVar112);
          auVar116 = vmulps_avx512vl(auVar112,auVar111);
          auVar120 = vmulps_avx512vl(auVar110,auVar109);
          auVar116 = vsubps_avx512vl(auVar116,auVar120);
          auVar120 = vmulps_avx512vl(auVar109,auVar109);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar111,auVar111);
          auVar115 = vmulps_avx512vl(auVar115,auVar115);
          auVar115 = vmulps_avx512vl(auVar115,auVar120);
          auVar116 = vmulps_avx512vl(auVar116,auVar116);
          uVar153 = vcmpps_avx512vl(auVar116,auVar115,2);
          local_2d0 = (byte)uVar24 & (byte)uVar153;
          if (local_2d0 == 0) {
            auVar230 = ZEXT3264(auVar122);
            auVar239 = ZEXT3264(auVar126);
          }
          else {
            auVar108 = vmulps_avx512vl(local_460,auVar108);
            auVar117 = vfmadd213ps_avx512vl(auVar117,local_140,auVar108);
            auVar107 = vfmadd213ps_avx512vl(auVar107,local_120,auVar117);
            auVar106 = vfmadd213ps_avx512vl(auVar106,local_100,auVar107);
            auVar118 = vmulps_avx512vl(local_460,auVar118);
            auVar119 = vfmadd213ps_avx512vl(auVar119,local_140,auVar118);
            auVar123 = vfmadd213ps_avx512vl(auVar123,local_120,auVar119);
            auVar107 = vfmadd213ps_avx512vl(auVar121,local_100,auVar123);
            auVar121 = *(undefined1 (*) [32])(lVar26 + 0x222cd38 + lVar85 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar26 + 0x222d1bc + lVar85 * 4);
            auVar119 = *(undefined1 (*) [32])(lVar26 + 0x222d640 + lVar85 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar26 + 0x222dac4 + lVar85 * 4);
            auVar117 = vmulps_avx512vl(local_520,auVar118);
            auVar108 = vmulps_avx512vl(local_540,auVar118);
            auVar118 = vmulps_avx512vl(local_460,auVar118);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar119,auVar126);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar119,local_500);
            auVar119 = vfmadd231ps_avx512vl(auVar118,local_140,auVar119);
            auVar118 = vfmadd231ps_avx512vl(auVar117,auVar123,auVar125);
            auVar117 = vfmadd231ps_avx512vl(auVar108,auVar123,auVar122);
            auVar123 = vfmadd231ps_avx512vl(auVar119,local_120,auVar123);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar121,auVar124);
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar121,local_400);
            auVar108 = vfmadd231ps_avx512vl(auVar123,local_100,auVar121);
            auVar121 = *(undefined1 (*) [32])(lVar26 + 0x222f158 + lVar85 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar26 + 0x222fa60 + lVar85 * 4);
            auVar119 = *(undefined1 (*) [32])(lVar26 + 0x222fee4 + lVar85 * 4);
            auVar115 = vmulps_avx512vl(local_520,auVar119);
            auVar116 = vmulps_avx512vl(local_540,auVar119);
            auVar119 = vmulps_avx512vl(local_460,auVar119);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar123,auVar126);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,local_500);
            auVar119 = vfmadd231ps_avx512vl(auVar119,local_140,auVar123);
            auVar123 = *(undefined1 (*) [32])(lVar26 + 0x222f5dc + lVar85 * 4);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar123,auVar125);
            auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,auVar122);
            auVar123 = vfmadd231ps_avx512vl(auVar119,local_120,auVar123);
            auVar119 = vfmadd231ps_avx512vl(auVar115,auVar121,auVar124);
            auVar115 = vfmadd231ps_avx512vl(auVar116,auVar121,local_400);
            auVar123 = vfmadd231ps_avx512vl(auVar123,local_100,auVar121);
            auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar118,auVar116);
            vandps_avx512vl(auVar117,auVar116);
            auVar121 = vmaxps_avx(auVar116,auVar116);
            vandps_avx512vl(auVar108,auVar116);
            auVar121 = vmaxps_avx(auVar121,auVar116);
            auVar79._4_4_ = fStack_47c;
            auVar79._0_4_ = local_480;
            auVar79._8_4_ = fStack_478;
            auVar79._12_4_ = fStack_474;
            auVar79._16_4_ = fStack_470;
            auVar79._20_4_ = fStack_46c;
            auVar79._24_4_ = fStack_468;
            auVar79._28_4_ = fStack_464;
            uVar83 = vcmpps_avx512vl(auVar121,auVar79,1);
            bVar13 = (bool)((byte)uVar83 & 1);
            auVar133._0_4_ = (float)((uint)bVar13 * auVar111._0_4_ | (uint)!bVar13 * auVar118._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar133._4_4_ = (float)((uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar118._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar133._8_4_ = (float)((uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar118._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar133._12_4_ =
                 (float)((uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar118._12_4_);
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar133._16_4_ =
                 (float)((uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * auVar118._16_4_);
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar133._20_4_ =
                 (float)((uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * auVar118._20_4_);
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar133._24_4_ =
                 (float)((uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * auVar118._24_4_);
            bVar13 = SUB81(uVar83 >> 7,0);
            auVar133._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar118._28_4_;
            bVar13 = (bool)((byte)uVar83 & 1);
            auVar134._0_4_ = (float)((uint)bVar13 * auVar109._0_4_ | (uint)!bVar13 * auVar117._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar117._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar117._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar117._12_4_);
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar134._16_4_ =
                 (float)((uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * auVar117._16_4_);
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar134._20_4_ =
                 (float)((uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * auVar117._20_4_);
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar134._24_4_ =
                 (float)((uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * auVar117._24_4_);
            bVar13 = SUB81(uVar83 >> 7,0);
            auVar134._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar117._28_4_;
            vandps_avx512vl(auVar119,auVar116);
            vandps_avx512vl(auVar115,auVar116);
            auVar121 = vmaxps_avx(auVar134,auVar134);
            vandps_avx512vl(auVar123,auVar116);
            auVar121 = vmaxps_avx(auVar121,auVar134);
            uVar83 = vcmpps_avx512vl(auVar121,auVar79,1);
            bVar13 = (bool)((byte)uVar83 & 1);
            auVar135._0_4_ = (uint)bVar13 * auVar111._0_4_ | (uint)!bVar13 * auVar119._0_4_;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar135._4_4_ = (uint)bVar13 * auVar111._4_4_ | (uint)!bVar13 * auVar119._4_4_;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar135._8_4_ = (uint)bVar13 * auVar111._8_4_ | (uint)!bVar13 * auVar119._8_4_;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar135._12_4_ = (uint)bVar13 * auVar111._12_4_ | (uint)!bVar13 * auVar119._12_4_;
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar135._16_4_ = (uint)bVar13 * auVar111._16_4_ | (uint)!bVar13 * auVar119._16_4_;
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar135._20_4_ = (uint)bVar13 * auVar111._20_4_ | (uint)!bVar13 * auVar119._20_4_;
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar135._24_4_ = (uint)bVar13 * auVar111._24_4_ | (uint)!bVar13 * auVar119._24_4_;
            bVar13 = SUB81(uVar83 >> 7,0);
            auVar135._28_4_ = (uint)bVar13 * auVar111._28_4_ | (uint)!bVar13 * auVar119._28_4_;
            bVar13 = (bool)((byte)uVar83 & 1);
            auVar136._0_4_ = (float)((uint)bVar13 * auVar109._0_4_ | (uint)!bVar13 * auVar115._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar136._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar115._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar136._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar115._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar136._12_4_ =
                 (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar115._12_4_);
            bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
            auVar136._16_4_ =
                 (float)((uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * auVar115._16_4_);
            bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
            auVar136._20_4_ =
                 (float)((uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * auVar115._20_4_);
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            auVar136._24_4_ =
                 (float)((uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * auVar115._24_4_);
            bVar13 = SUB81(uVar83 >> 7,0);
            auVar136._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar115._28_4_;
            auVar219._8_4_ = 0x80000000;
            auVar219._0_8_ = 0x8000000080000000;
            auVar219._12_4_ = 0x80000000;
            auVar219._16_4_ = 0x80000000;
            auVar219._20_4_ = 0x80000000;
            auVar219._24_4_ = 0x80000000;
            auVar219._28_4_ = 0x80000000;
            auVar121 = vxorps_avx512vl(auVar135,auVar219);
            auVar115 = auVar235._0_32_;
            auVar123 = vfmadd213ps_avx512vl(auVar133,auVar133,auVar115);
            auVar99 = vfmadd231ps_fma(auVar123,auVar134,auVar134);
            auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar99));
            auVar228._8_4_ = 0xbf000000;
            auVar228._0_8_ = 0xbf000000bf000000;
            auVar228._12_4_ = 0xbf000000;
            auVar228._16_4_ = 0xbf000000;
            auVar228._20_4_ = 0xbf000000;
            auVar228._24_4_ = 0xbf000000;
            auVar228._28_4_ = 0xbf000000;
            fVar187 = auVar123._0_4_;
            fVar203 = auVar123._4_4_;
            fVar186 = auVar123._8_4_;
            fVar202 = auVar123._12_4_;
            fVar204 = auVar123._16_4_;
            fVar205 = auVar123._20_4_;
            fVar181 = auVar123._24_4_;
            auVar53._4_4_ = fVar203 * fVar203 * fVar203 * auVar99._4_4_ * -0.5;
            auVar53._0_4_ = fVar187 * fVar187 * fVar187 * auVar99._0_4_ * -0.5;
            auVar53._8_4_ = fVar186 * fVar186 * fVar186 * auVar99._8_4_ * -0.5;
            auVar53._12_4_ = fVar202 * fVar202 * fVar202 * auVar99._12_4_ * -0.5;
            auVar53._16_4_ = fVar204 * fVar204 * fVar204 * -0.0;
            auVar53._20_4_ = fVar205 * fVar205 * fVar205 * -0.0;
            auVar53._24_4_ = fVar181 * fVar181 * fVar181 * -0.0;
            auVar53._28_4_ = auVar134._28_4_;
            auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar123 = vfmadd231ps_avx512vl(auVar53,auVar119,auVar123);
            auVar54._4_4_ = auVar134._4_4_ * auVar123._4_4_;
            auVar54._0_4_ = auVar134._0_4_ * auVar123._0_4_;
            auVar54._8_4_ = auVar134._8_4_ * auVar123._8_4_;
            auVar54._12_4_ = auVar134._12_4_ * auVar123._12_4_;
            auVar54._16_4_ = auVar134._16_4_ * auVar123._16_4_;
            auVar54._20_4_ = auVar134._20_4_ * auVar123._20_4_;
            auVar54._24_4_ = auVar134._24_4_ * auVar123._24_4_;
            auVar54._28_4_ = 0;
            auVar55._4_4_ = auVar123._4_4_ * -auVar133._4_4_;
            auVar55._0_4_ = auVar123._0_4_ * -auVar133._0_4_;
            auVar55._8_4_ = auVar123._8_4_ * -auVar133._8_4_;
            auVar55._12_4_ = auVar123._12_4_ * -auVar133._12_4_;
            auVar55._16_4_ = auVar123._16_4_ * -auVar133._16_4_;
            auVar55._20_4_ = auVar123._20_4_ * -auVar133._20_4_;
            auVar55._24_4_ = auVar123._24_4_ * -auVar133._24_4_;
            auVar55._28_4_ = auVar134._28_4_;
            auVar118 = vmulps_avx512vl(auVar123,auVar115);
            auVar123 = vfmadd213ps_avx512vl(auVar135,auVar135,auVar115);
            auVar123 = vfmadd231ps_avx512vl(auVar123,auVar136,auVar136);
            auVar117 = vrsqrt14ps_avx512vl(auVar123);
            auVar123 = vmulps_avx512vl(auVar123,auVar228);
            fVar187 = auVar117._0_4_;
            fVar203 = auVar117._4_4_;
            fVar186 = auVar117._8_4_;
            fVar202 = auVar117._12_4_;
            fVar204 = auVar117._16_4_;
            fVar205 = auVar117._20_4_;
            fVar181 = auVar117._24_4_;
            auVar56._4_4_ = fVar203 * fVar203 * fVar203 * auVar123._4_4_;
            auVar56._0_4_ = fVar187 * fVar187 * fVar187 * auVar123._0_4_;
            auVar56._8_4_ = fVar186 * fVar186 * fVar186 * auVar123._8_4_;
            auVar56._12_4_ = fVar202 * fVar202 * fVar202 * auVar123._12_4_;
            auVar56._16_4_ = fVar204 * fVar204 * fVar204 * auVar123._16_4_;
            auVar56._20_4_ = fVar205 * fVar205 * fVar205 * auVar123._20_4_;
            auVar56._24_4_ = fVar181 * fVar181 * fVar181 * auVar123._24_4_;
            auVar56._28_4_ = auVar123._28_4_;
            auVar123 = vfmadd231ps_avx512vl(auVar56,auVar119,auVar117);
            auVar57._4_4_ = auVar136._4_4_ * auVar123._4_4_;
            auVar57._0_4_ = auVar136._0_4_ * auVar123._0_4_;
            auVar57._8_4_ = auVar136._8_4_ * auVar123._8_4_;
            auVar57._12_4_ = auVar136._12_4_ * auVar123._12_4_;
            auVar57._16_4_ = auVar136._16_4_ * auVar123._16_4_;
            auVar57._20_4_ = auVar136._20_4_ * auVar123._20_4_;
            auVar57._24_4_ = auVar136._24_4_ * auVar123._24_4_;
            auVar57._28_4_ = auVar117._28_4_;
            auVar58._4_4_ = auVar123._4_4_ * auVar121._4_4_;
            auVar58._0_4_ = auVar123._0_4_ * auVar121._0_4_;
            auVar58._8_4_ = auVar123._8_4_ * auVar121._8_4_;
            auVar58._12_4_ = auVar123._12_4_ * auVar121._12_4_;
            auVar58._16_4_ = auVar123._16_4_ * auVar121._16_4_;
            auVar58._20_4_ = auVar123._20_4_ * auVar121._20_4_;
            auVar58._24_4_ = auVar123._24_4_ * auVar121._24_4_;
            auVar58._28_4_ = auVar121._28_4_;
            auVar121 = vmulps_avx512vl(auVar123,auVar115);
            auVar99 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar98),auVar110);
            auVar123 = ZEXT1632(auVar98);
            auVar103 = vfmadd213ps_fma(auVar55,auVar123,auVar112);
            auVar119 = vfmadd213ps_avx512vl(auVar118,auVar123,auVar107);
            auVar117 = vfmadd213ps_avx512vl(auVar57,ZEXT1632(auVar97),auVar113);
            auVar23 = vfnmadd213ps_fma(auVar54,auVar123,auVar110);
            auVar108 = ZEXT1632(auVar97);
            auVar234 = vfmadd213ps_fma(auVar58,auVar108,auVar114);
            auVar100 = vfnmadd213ps_fma(auVar55,auVar123,auVar112);
            auVar20 = vfmadd213ps_fma(auVar121,auVar108,auVar106);
            auVar112 = ZEXT1632(auVar98);
            auVar102 = vfnmadd231ps_fma(auVar107,auVar112,auVar118);
            auVar101 = vfnmadd213ps_fma(auVar57,auVar108,auVar113);
            auVar28 = vfnmadd213ps_fma(auVar58,auVar108,auVar114);
            auVar29 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar97),auVar121);
            auVar106 = vsubps_avx512vl(auVar117,ZEXT1632(auVar23));
            auVar121 = vsubps_avx(ZEXT1632(auVar234),ZEXT1632(auVar100));
            auVar123 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar102));
            auVar59._4_4_ = auVar121._4_4_ * auVar102._4_4_;
            auVar59._0_4_ = auVar121._0_4_ * auVar102._0_4_;
            auVar59._8_4_ = auVar121._8_4_ * auVar102._8_4_;
            auVar59._12_4_ = auVar121._12_4_ * auVar102._12_4_;
            auVar59._16_4_ = auVar121._16_4_ * 0.0;
            auVar59._20_4_ = auVar121._20_4_ * 0.0;
            auVar59._24_4_ = auVar121._24_4_ * 0.0;
            auVar59._28_4_ = auVar118._28_4_;
            auVar98 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar100),auVar123);
            auVar60._4_4_ = auVar123._4_4_ * auVar23._4_4_;
            auVar60._0_4_ = auVar123._0_4_ * auVar23._0_4_;
            auVar60._8_4_ = auVar123._8_4_ * auVar23._8_4_;
            auVar60._12_4_ = auVar123._12_4_ * auVar23._12_4_;
            auVar60._16_4_ = auVar123._16_4_ * 0.0;
            auVar60._20_4_ = auVar123._20_4_ * 0.0;
            auVar60._24_4_ = auVar123._24_4_ * 0.0;
            auVar60._28_4_ = auVar123._28_4_;
            auVar21 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar102),auVar106);
            auVar61._4_4_ = auVar100._4_4_ * auVar106._4_4_;
            auVar61._0_4_ = auVar100._0_4_ * auVar106._0_4_;
            auVar61._8_4_ = auVar100._8_4_ * auVar106._8_4_;
            auVar61._12_4_ = auVar100._12_4_ * auVar106._12_4_;
            auVar61._16_4_ = auVar106._16_4_ * 0.0;
            auVar61._20_4_ = auVar106._20_4_ * 0.0;
            auVar61._24_4_ = auVar106._24_4_ * 0.0;
            auVar61._28_4_ = auVar106._28_4_;
            auVar22 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar23),auVar121);
            auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar115,ZEXT1632(auVar21));
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar115,ZEXT1632(auVar98));
            uVar83 = vcmpps_avx512vl(auVar121,auVar115,2);
            bVar90 = (byte)uVar83;
            fVar93 = (float)((uint)(bVar90 & 1) * auVar99._0_4_ |
                            (uint)!(bool)(bVar90 & 1) * auVar101._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar146 = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar101._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar148 = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar101._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar150 = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar101._12_4_);
            auVar108 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar148,CONCAT44(fVar146,fVar93))));
            fVar145 = (float)((uint)(bVar90 & 1) * auVar103._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * auVar28._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            fVar147 = (float)((uint)bVar13 * auVar103._4_4_ | (uint)!bVar13 * auVar28._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            fVar149 = (float)((uint)bVar13 * auVar103._8_4_ | (uint)!bVar13 * auVar28._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            fVar151 = (float)((uint)bVar13 * auVar103._12_4_ | (uint)!bVar13 * auVar28._12_4_);
            auVar111 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar149,CONCAT44(fVar147,fVar145))));
            auVar137._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar119._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar29._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar137._4_4_ = (float)((uint)bVar13 * auVar119._4_4_ | (uint)!bVar13 * auVar29._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar137._8_4_ = (float)((uint)bVar13 * auVar119._8_4_ | (uint)!bVar13 * auVar29._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar137._12_4_ =
                 (float)((uint)bVar13 * auVar119._12_4_ | (uint)!bVar13 * auVar29._12_4_);
            fVar187 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar119._16_4_);
            auVar137._16_4_ = fVar187;
            fVar186 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar119._20_4_);
            auVar137._20_4_ = fVar186;
            fVar203 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar119._24_4_);
            auVar137._24_4_ = fVar203;
            iVar1 = (uint)(byte)(uVar83 >> 7) * auVar119._28_4_;
            auVar137._28_4_ = iVar1;
            auVar121 = vblendmps_avx512vl(ZEXT1632(auVar23),auVar117);
            auVar138._0_4_ =
                 (uint)(bVar90 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar98._0_4_;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar138._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar98._4_4_;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar138._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar98._8_4_;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar138._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar98._12_4_;
            auVar138._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar121._16_4_;
            auVar138._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar121._20_4_;
            auVar138._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar121._24_4_;
            auVar138._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar121._28_4_;
            auVar121 = vblendmps_avx512vl(ZEXT1632(auVar100),ZEXT1632(auVar234));
            auVar139._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar121._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar99._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar99._4_4_);
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar99._8_4_);
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar99._12_4_);
            fVar204 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar121._16_4_);
            auVar139._16_4_ = fVar204;
            fVar205 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar121._20_4_);
            auVar139._20_4_ = fVar205;
            fVar202 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar121._24_4_);
            auVar139._24_4_ = fVar202;
            auVar139._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar121._28_4_;
            auVar121 = vblendmps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar20));
            auVar140._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar121._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar103._0_4_);
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar140._4_4_ = (float)((uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * auVar103._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar140._8_4_ = (float)((uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * auVar103._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar140._12_4_ =
                 (float)((uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * auVar103._12_4_);
            fVar92 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar121._16_4_);
            auVar140._16_4_ = fVar92;
            fVar185 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar121._20_4_);
            auVar140._20_4_ = fVar185;
            fVar181 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar121._24_4_);
            auVar140._24_4_ = fVar181;
            iVar2 = (uint)(byte)(uVar83 >> 7) * auVar121._28_4_;
            auVar140._28_4_ = iVar2;
            auVar141._0_4_ =
                 (uint)(bVar90 & 1) * (int)auVar23._0_4_ |
                 (uint)!(bool)(bVar90 & 1) * auVar117._0_4_;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar13 * (int)auVar23._4_4_ | (uint)!bVar13 * auVar117._4_4_;
            bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar13 * (int)auVar23._8_4_ | (uint)!bVar13 * auVar117._8_4_;
            bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar13 * (int)auVar23._12_4_ | (uint)!bVar13 * auVar117._12_4_;
            auVar141._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar117._16_4_;
            auVar141._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar117._20_4_;
            auVar141._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar117._24_4_;
            auVar141._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar117._28_4_;
            bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
            auVar117 = vsubps_avx512vl(auVar141,auVar108);
            auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar100._12_4_ |
                                                     (uint)!bVar17 * auVar234._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar100._8_4_ |
                                                              (uint)!bVar15 * auVar234._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar100._4_4_ |
                                                                       (uint)!bVar13 *
                                                                       auVar234._4_4_,
                                                                       (uint)(bVar90 & 1) *
                                                                       (int)auVar100._0_4_ |
                                                                       (uint)!(bool)(bVar90 & 1) *
                                                                       auVar234._0_4_)))),auVar111);
            auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar102._12_4_ |
                                                     (uint)!bVar18 * auVar20._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar102._8_4_ |
                                                              (uint)!bVar16 * auVar20._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar102._4_4_ |
                                                                       (uint)!bVar14 * auVar20._4_4_
                                                                       ,(uint)(bVar90 & 1) *
                                                                        (int)auVar102._0_4_ |
                                                                        (uint)!(bool)(bVar90 & 1) *
                                                                        auVar20._0_4_)))),auVar137);
            auVar118 = vsubps_avx(auVar108,auVar138);
            auVar106 = vsubps_avx(auVar111,auVar139);
            auVar107 = vsubps_avx(auVar137,auVar140);
            auVar62._4_4_ = auVar119._4_4_ * fVar146;
            auVar62._0_4_ = auVar119._0_4_ * fVar93;
            auVar62._8_4_ = auVar119._8_4_ * fVar148;
            auVar62._12_4_ = auVar119._12_4_ * fVar150;
            auVar62._16_4_ = auVar119._16_4_ * 0.0;
            auVar62._20_4_ = auVar119._20_4_ * 0.0;
            auVar62._24_4_ = auVar119._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar98 = vfmsub231ps_fma(auVar62,auVar137,auVar117);
            auVar184._0_4_ = fVar145 * auVar117._0_4_;
            auVar184._4_4_ = fVar147 * auVar117._4_4_;
            auVar184._8_4_ = fVar149 * auVar117._8_4_;
            auVar184._12_4_ = fVar151 * auVar117._12_4_;
            auVar184._16_4_ = auVar117._16_4_ * 0.0;
            auVar184._20_4_ = auVar117._20_4_ * 0.0;
            auVar184._24_4_ = auVar117._24_4_ * 0.0;
            auVar184._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar184,auVar108,auVar123);
            auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar115,ZEXT1632(auVar98));
            auVar200._0_4_ = auVar123._0_4_ * auVar137._0_4_;
            auVar200._4_4_ = auVar123._4_4_ * auVar137._4_4_;
            auVar200._8_4_ = auVar123._8_4_ * auVar137._8_4_;
            auVar200._12_4_ = auVar123._12_4_ * auVar137._12_4_;
            auVar200._16_4_ = auVar123._16_4_ * fVar187;
            auVar200._20_4_ = auVar123._20_4_ * fVar186;
            auVar200._24_4_ = auVar123._24_4_ * fVar203;
            auVar200._28_4_ = 0;
            auVar98 = vfmsub231ps_fma(auVar200,auVar111,auVar119);
            auVar109 = vfmadd231ps_avx512vl(auVar121,auVar115,ZEXT1632(auVar98));
            auVar121 = vmulps_avx512vl(auVar107,auVar138);
            auVar121 = vfmsub231ps_avx512vl(auVar121,auVar118,auVar140);
            auVar63._4_4_ = auVar106._4_4_ * auVar140._4_4_;
            auVar63._0_4_ = auVar106._0_4_ * auVar140._0_4_;
            auVar63._8_4_ = auVar106._8_4_ * auVar140._8_4_;
            auVar63._12_4_ = auVar106._12_4_ * auVar140._12_4_;
            auVar63._16_4_ = auVar106._16_4_ * fVar92;
            auVar63._20_4_ = auVar106._20_4_ * fVar185;
            auVar63._24_4_ = auVar106._24_4_ * fVar181;
            auVar63._28_4_ = iVar2;
            auVar98 = vfmsub231ps_fma(auVar63,auVar139,auVar107);
            auVar201._0_4_ = auVar139._0_4_ * auVar118._0_4_;
            auVar201._4_4_ = auVar139._4_4_ * auVar118._4_4_;
            auVar201._8_4_ = auVar139._8_4_ * auVar118._8_4_;
            auVar201._12_4_ = auVar139._12_4_ * auVar118._12_4_;
            auVar201._16_4_ = fVar204 * auVar118._16_4_;
            auVar201._20_4_ = fVar205 * auVar118._20_4_;
            auVar201._24_4_ = fVar202 * auVar118._24_4_;
            auVar201._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar201,auVar106,auVar138);
            auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar115,auVar121);
            auVar110 = vfmadd231ps_avx512vl(auVar121,auVar115,ZEXT1632(auVar98));
            auVar121 = vmaxps_avx(auVar109,auVar110);
            uVar153 = vcmpps_avx512vl(auVar121,auVar115,2);
            local_2d0 = local_2d0 & (byte)uVar153;
            if (local_2d0 == 0) {
LAB_01c497d5:
              local_2d0 = 0;
            }
            else {
              auVar64._4_4_ = auVar107._4_4_ * auVar123._4_4_;
              auVar64._0_4_ = auVar107._0_4_ * auVar123._0_4_;
              auVar64._8_4_ = auVar107._8_4_ * auVar123._8_4_;
              auVar64._12_4_ = auVar107._12_4_ * auVar123._12_4_;
              auVar64._16_4_ = auVar107._16_4_ * auVar123._16_4_;
              auVar64._20_4_ = auVar107._20_4_ * auVar123._20_4_;
              auVar64._24_4_ = auVar107._24_4_ * auVar123._24_4_;
              auVar64._28_4_ = auVar121._28_4_;
              auVar103 = vfmsub231ps_fma(auVar64,auVar106,auVar119);
              auVar65._4_4_ = auVar119._4_4_ * auVar118._4_4_;
              auVar65._0_4_ = auVar119._0_4_ * auVar118._0_4_;
              auVar65._8_4_ = auVar119._8_4_ * auVar118._8_4_;
              auVar65._12_4_ = auVar119._12_4_ * auVar118._12_4_;
              auVar65._16_4_ = auVar119._16_4_ * auVar118._16_4_;
              auVar65._20_4_ = auVar119._20_4_ * auVar118._20_4_;
              auVar65._24_4_ = auVar119._24_4_ * auVar118._24_4_;
              auVar65._28_4_ = auVar119._28_4_;
              auVar99 = vfmsub231ps_fma(auVar65,auVar117,auVar107);
              auVar66._4_4_ = auVar106._4_4_ * auVar117._4_4_;
              auVar66._0_4_ = auVar106._0_4_ * auVar117._0_4_;
              auVar66._8_4_ = auVar106._8_4_ * auVar117._8_4_;
              auVar66._12_4_ = auVar106._12_4_ * auVar117._12_4_;
              auVar66._16_4_ = auVar106._16_4_ * auVar117._16_4_;
              auVar66._20_4_ = auVar106._20_4_ * auVar117._20_4_;
              auVar66._24_4_ = auVar106._24_4_ * auVar117._24_4_;
              auVar66._28_4_ = auVar106._28_4_;
              auVar234 = vfmsub231ps_fma(auVar66,auVar118,auVar123);
              auVar98 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar234));
              auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar103),auVar115);
              auVar123 = vrcp14ps_avx512vl(auVar121);
              auVar39._8_4_ = 0x3f800000;
              auVar39._0_8_ = &DAT_3f8000003f800000;
              auVar39._12_4_ = 0x3f800000;
              auVar39._16_4_ = 0x3f800000;
              auVar39._20_4_ = 0x3f800000;
              auVar39._24_4_ = 0x3f800000;
              auVar39._28_4_ = 0x3f800000;
              auVar119 = vfnmadd213ps_avx512vl(auVar123,auVar121,auVar39);
              auVar98 = vfmadd132ps_fma(auVar119,auVar123,auVar123);
              auVar67._4_4_ = auVar234._4_4_ * auVar137._4_4_;
              auVar67._0_4_ = auVar234._0_4_ * auVar137._0_4_;
              auVar67._8_4_ = auVar234._8_4_ * auVar137._8_4_;
              auVar67._12_4_ = auVar234._12_4_ * auVar137._12_4_;
              auVar67._16_4_ = fVar187 * 0.0;
              auVar67._20_4_ = fVar186 * 0.0;
              auVar67._24_4_ = fVar203 * 0.0;
              auVar67._28_4_ = iVar1;
              auVar99 = vfmadd231ps_fma(auVar67,auVar111,ZEXT1632(auVar99));
              auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar108,ZEXT1632(auVar103));
              fVar187 = auVar98._0_4_;
              fVar203 = auVar98._4_4_;
              fVar186 = auVar98._8_4_;
              fVar202 = auVar98._12_4_;
              auVar123 = ZEXT1632(CONCAT412(auVar99._12_4_ * fVar202,
                                            CONCAT48(auVar99._8_4_ * fVar186,
                                                     CONCAT44(auVar99._4_4_ * fVar203,
                                                              auVar99._0_4_ * fVar187))));
              auVar80._4_4_ = uStack_3bc;
              auVar80._0_4_ = local_3c0;
              auVar80._8_4_ = uStack_3b8;
              auVar80._12_4_ = uStack_3b4;
              auVar80._16_4_ = uStack_3b0;
              auVar80._20_4_ = uStack_3ac;
              auVar80._24_4_ = uStack_3a8;
              auVar80._28_4_ = uStack_3a4;
              uVar153 = vcmpps_avx512vl(auVar123,auVar80,0xd);
              uVar152 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar40._4_4_ = uVar152;
              auVar40._0_4_ = uVar152;
              auVar40._8_4_ = uVar152;
              auVar40._12_4_ = uVar152;
              auVar40._16_4_ = uVar152;
              auVar40._20_4_ = uVar152;
              auVar40._24_4_ = uVar152;
              auVar40._28_4_ = uVar152;
              uVar24 = vcmpps_avx512vl(auVar123,auVar40,2);
              local_2d0 = (byte)uVar153 & (byte)uVar24 & local_2d0;
              if (local_2d0 == 0) goto LAB_01c497d5;
              uVar153 = vcmpps_avx512vl(auVar121,auVar115,4);
              if ((local_2d0 & (byte)uVar153) == 0) {
                local_2d0 = 0;
              }
              else {
                local_2d0 = local_2d0 & (byte)uVar153;
                fVar204 = auVar109._0_4_ * fVar187;
                fVar205 = auVar109._4_4_ * fVar203;
                auVar68._4_4_ = fVar205;
                auVar68._0_4_ = fVar204;
                fVar181 = auVar109._8_4_ * fVar186;
                auVar68._8_4_ = fVar181;
                fVar185 = auVar109._12_4_ * fVar202;
                auVar68._12_4_ = fVar185;
                fVar92 = auVar109._16_4_ * 0.0;
                auVar68._16_4_ = fVar92;
                fVar93 = auVar109._20_4_ * 0.0;
                auVar68._20_4_ = fVar93;
                fVar145 = auVar109._24_4_ * 0.0;
                auVar68._24_4_ = fVar145;
                auVar68._28_4_ = auVar109._28_4_;
                fVar187 = auVar110._0_4_ * fVar187;
                fVar203 = auVar110._4_4_ * fVar203;
                auVar69._4_4_ = fVar203;
                auVar69._0_4_ = fVar187;
                fVar186 = auVar110._8_4_ * fVar186;
                auVar69._8_4_ = fVar186;
                fVar202 = auVar110._12_4_ * fVar202;
                auVar69._12_4_ = fVar202;
                fVar146 = auVar110._16_4_ * 0.0;
                auVar69._16_4_ = fVar146;
                fVar147 = auVar110._20_4_ * 0.0;
                auVar69._20_4_ = fVar147;
                fVar148 = auVar110._24_4_ * 0.0;
                auVar69._24_4_ = fVar148;
                auVar69._28_4_ = auVar110._28_4_;
                auVar210._8_4_ = 0x3f800000;
                auVar210._0_8_ = &DAT_3f8000003f800000;
                auVar210._12_4_ = 0x3f800000;
                auVar210._16_4_ = 0x3f800000;
                auVar210._20_4_ = 0x3f800000;
                auVar210._24_4_ = 0x3f800000;
                auVar210._28_4_ = 0x3f800000;
                auVar121 = vsubps_avx(auVar210,auVar68);
                local_5a0._0_4_ =
                     (uint)(bVar90 & 1) * (int)fVar204 | (uint)!(bool)(bVar90 & 1) * auVar121._0_4_;
                bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                local_5a0._4_4_ = (uint)bVar13 * (int)fVar205 | (uint)!bVar13 * auVar121._4_4_;
                bVar13 = (bool)((byte)(uVar83 >> 2) & 1);
                local_5a0._8_4_ = (uint)bVar13 * (int)fVar181 | (uint)!bVar13 * auVar121._8_4_;
                bVar13 = (bool)((byte)(uVar83 >> 3) & 1);
                local_5a0._12_4_ = (uint)bVar13 * (int)fVar185 | (uint)!bVar13 * auVar121._12_4_;
                bVar13 = (bool)((byte)(uVar83 >> 4) & 1);
                local_5a0._16_4_ = (uint)bVar13 * (int)fVar92 | (uint)!bVar13 * auVar121._16_4_;
                bVar13 = (bool)((byte)(uVar83 >> 5) & 1);
                local_5a0._20_4_ = (uint)bVar13 * (int)fVar93 | (uint)!bVar13 * auVar121._20_4_;
                bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
                local_5a0._24_4_ = (uint)bVar13 * (int)fVar145 | (uint)!bVar13 * auVar121._24_4_;
                bVar13 = SUB81(uVar83 >> 7,0);
                local_5a0._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar121._28_4_;
                auVar121 = vsubps_avx(auVar210,auVar69);
                bVar13 = (bool)((byte)(uVar83 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar83 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar83 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar83 >> 6) & 1);
                bVar19 = SUB81(uVar83 >> 7,0);
                local_1c0._4_4_ = (uint)bVar13 * (int)fVar203 | (uint)!bVar13 * auVar121._4_4_;
                local_1c0._0_4_ =
                     (uint)(bVar90 & 1) * (int)fVar187 | (uint)!(bool)(bVar90 & 1) * auVar121._0_4_;
                local_1c0._8_4_ = (uint)bVar14 * (int)fVar186 | (uint)!bVar14 * auVar121._8_4_;
                local_1c0._12_4_ = (uint)bVar15 * (int)fVar202 | (uint)!bVar15 * auVar121._12_4_;
                local_1c0._16_4_ = (uint)bVar16 * (int)fVar146 | (uint)!bVar16 * auVar121._16_4_;
                local_1c0._20_4_ = (uint)bVar17 * (int)fVar147 | (uint)!bVar17 * auVar121._20_4_;
                local_1c0._24_4_ = (uint)bVar18 * (int)fVar148 | (uint)!bVar18 * auVar121._24_4_;
                local_1c0._28_4_ = (uint)bVar19 * auVar110._28_4_ | (uint)!bVar19 * auVar121._28_4_;
                local_5c0 = auVar123;
              }
            }
            auVar239 = ZEXT3264(local_660);
            auVar230 = ZEXT3264(local_640);
            if (local_2d0 != 0) {
              auVar121 = vsubps_avx(ZEXT1632(auVar97),auVar112);
              auVar98 = vfmadd213ps_fma(auVar121,local_5a0,auVar112);
              uVar152 = *(undefined4 *)((long)local_6b8->ray_space + k * 4 + -0x10);
              auVar41._4_4_ = uVar152;
              auVar41._0_4_ = uVar152;
              auVar41._8_4_ = uVar152;
              auVar41._12_4_ = uVar152;
              auVar41._16_4_ = uVar152;
              auVar41._20_4_ = uVar152;
              auVar41._24_4_ = uVar152;
              auVar41._28_4_ = uVar152;
              auVar121 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar98._12_4_ + auVar98._12_4_,
                                                            CONCAT48(auVar98._8_4_ + auVar98._8_4_,
                                                                     CONCAT44(auVar98._4_4_ +
                                                                              auVar98._4_4_,
                                                                              auVar98._0_4_ +
                                                                              auVar98._0_4_)))),
                                         auVar41);
              uVar153 = vcmpps_avx512vl(local_5c0,auVar121,6);
              local_2d0 = local_2d0 & (byte)uVar153;
              if (local_2d0 != 0) {
                auVar164._8_4_ = 0xbf800000;
                auVar164._0_8_ = 0xbf800000bf800000;
                auVar164._12_4_ = 0xbf800000;
                auVar164._16_4_ = 0xbf800000;
                auVar164._20_4_ = 0xbf800000;
                auVar164._24_4_ = 0xbf800000;
                auVar164._28_4_ = 0xbf800000;
                auVar42._8_4_ = 0x40000000;
                auVar42._0_8_ = 0x4000000040000000;
                auVar42._12_4_ = 0x40000000;
                auVar42._16_4_ = 0x40000000;
                auVar42._20_4_ = 0x40000000;
                auVar42._24_4_ = 0x40000000;
                auVar42._28_4_ = 0x40000000;
                local_360 = vfmadd132ps_avx512vl(local_1c0,auVar164,auVar42);
                local_1c0 = local_360;
                auVar121 = local_1c0;
                local_320 = (undefined4)lVar85;
                local_310 = local_6b0._0_8_;
                uStack_308 = local_6b0._8_8_;
                local_300 = local_5d0._0_8_;
                uStack_2f8 = local_5d0._8_8_;
                local_2f0 = local_5e0._0_8_;
                uStack_2e8 = local_5e0._8_8_;
                local_2e0 = local_5f0;
                uStack_2d8 = uStack_5e8;
                pGVar87 = (context->scene->geometries).items[uVar88].ptr;
                local_1c0 = auVar121;
                if ((pGVar87->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar98 = vcvtsi2ss_avx512f(auVar229._0_16_,local_320);
                  fVar187 = auVar98._0_4_;
                  local_2c0[0] = (fVar187 + local_5a0._0_4_ + 0.0) * (float)local_3a0._0_4_;
                  local_2c0[1] = (fVar187 + local_5a0._4_4_ + 1.0) * (float)local_3a0._4_4_;
                  local_2c0[2] = (fVar187 + local_5a0._8_4_ + 2.0) * fStack_398;
                  local_2c0[3] = (fVar187 + local_5a0._12_4_ + 3.0) * fStack_394;
                  fStack_2b0 = (fVar187 + local_5a0._16_4_ + 4.0) * fStack_390;
                  fStack_2ac = (fVar187 + local_5a0._20_4_ + 5.0) * fStack_38c;
                  fStack_2a8 = (fVar187 + local_5a0._24_4_ + 6.0) * fStack_388;
                  fStack_2a4 = fVar187 + local_5a0._28_4_ + 7.0;
                  local_1c0._0_8_ = local_360._0_8_;
                  local_1c0._8_8_ = local_360._8_8_;
                  local_1c0._16_8_ = local_360._16_8_;
                  local_1c0._24_8_ = local_360._24_8_;
                  local_2a0 = local_1c0._0_8_;
                  uStack_298 = local_1c0._8_8_;
                  uStack_290 = local_1c0._16_8_;
                  uStack_288 = local_1c0._24_8_;
                  local_280 = local_5c0;
                  auVar165._8_4_ = 0x7f800000;
                  auVar165._0_8_ = 0x7f8000007f800000;
                  auVar165._12_4_ = 0x7f800000;
                  auVar165._16_4_ = 0x7f800000;
                  auVar165._20_4_ = 0x7f800000;
                  auVar165._24_4_ = 0x7f800000;
                  auVar165._28_4_ = 0x7f800000;
                  auVar121 = vblendmps_avx512vl(auVar165,local_5c0);
                  auVar142._0_4_ =
                       (uint)(local_2d0 & 1) * auVar121._0_4_ |
                       (uint)!(bool)(local_2d0 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_2d0 >> 1 & 1);
                  auVar142._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2d0 >> 2 & 1);
                  auVar142._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2d0 >> 3 & 1);
                  auVar142._12_4_ = (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2d0 >> 4 & 1);
                  auVar142._16_4_ = (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2d0 >> 5 & 1);
                  auVar142._20_4_ = (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_2d0 >> 6 & 1);
                  auVar142._24_4_ = (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar142._28_4_ =
                       (uint)(local_2d0 >> 7) * auVar121._28_4_ |
                       (uint)!(bool)(local_2d0 >> 7) * 0x7f800000;
                  auVar121 = vshufps_avx(auVar142,auVar142,0xb1);
                  auVar121 = vminps_avx(auVar142,auVar121);
                  auVar123 = vshufpd_avx(auVar121,auVar121,5);
                  auVar121 = vminps_avx(auVar121,auVar123);
                  auVar123 = vpermpd_avx2(auVar121,0x4e);
                  auVar121 = vminps_avx(auVar121,auVar123);
                  uVar153 = vcmpps_avx512vl(auVar142,auVar121,0);
                  bVar82 = (byte)uVar153 & local_2d0;
                  bVar90 = local_2d0;
                  if (bVar82 != 0) {
                    bVar90 = bVar82;
                  }
                  uVar25 = 0;
                  for (uVar84 = (uint)bVar90; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000)
                  {
                    uVar25 = uVar25 + 1;
                  }
                  uVar83 = (ulong)uVar25;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar87->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar187 = local_2c0[uVar83];
                    uVar152 = *(undefined4 *)((long)&local_2a0 + uVar83 * 4);
                    fVar203 = 1.0 - fVar187;
                    auVar33._8_4_ = 0x80000000;
                    auVar33._0_8_ = 0x8000000080000000;
                    auVar33._12_4_ = 0x80000000;
                    auVar99 = vxorps_avx512vl(ZEXT416((uint)fVar203),auVar33);
                    auVar98 = ZEXT416((uint)(fVar187 * fVar203 * 4.0));
                    auVar97 = vfnmsub213ss_fma(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),auVar98
                                              );
                    auVar98 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),auVar98)
                    ;
                    fVar203 = fVar203 * auVar99._0_4_ * 0.5;
                    fVar186 = auVar97._0_4_ * 0.5;
                    fVar202 = auVar98._0_4_ * 0.5;
                    fVar204 = fVar187 * fVar187 * 0.5;
                    auVar192._0_4_ = fVar204 * (float)local_5f0._0_4_;
                    auVar192._4_4_ = fVar204 * (float)local_5f0._4_4_;
                    auVar192._8_4_ = fVar204 * (float)uStack_5e8;
                    auVar192._12_4_ = fVar204 * uStack_5e8._4_4_;
                    auVar179._4_4_ = fVar202;
                    auVar179._0_4_ = fVar202;
                    auVar179._8_4_ = fVar202;
                    auVar179._12_4_ = fVar202;
                    auVar98 = vfmadd132ps_fma(auVar179,auVar192,local_5e0);
                    auVar193._4_4_ = fVar186;
                    auVar193._0_4_ = fVar186;
                    auVar193._8_4_ = fVar186;
                    auVar193._12_4_ = fVar186;
                    auVar98 = vfmadd132ps_fma(auVar193,auVar98,local_5d0);
                    auVar180._4_4_ = fVar203;
                    auVar180._0_4_ = fVar203;
                    auVar180._8_4_ = fVar203;
                    auVar180._12_4_ = fVar203;
                    auVar98 = vfmadd132ps_fma(auVar180,auVar98,local_6b0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar83 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar98._0_4_;
                    uVar9 = vextractps_avx(auVar98,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                    uVar9 = vextractps_avx(auVar98,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar9;
                    *(float *)(ray + k * 4 + 0xf0) = fVar187;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar152;
                    *(uint *)(ray + k * 4 + 0x110) = uVar7;
                    *(uint *)(ray + k * 4 + 0x120) = uVar88;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_4d0 = local_5d0._0_8_;
                    uStack_4c8 = local_5d0._8_8_;
                    local_4e0 = local_5e0._0_4_;
                    fStack_4dc = local_5e0._4_4_;
                    fStack_4d8 = local_5e0._8_4_;
                    fStack_4d4 = local_5e0._12_4_;
                    _local_610 = _local_5f0;
                    local_160 = vmovdqa64_avx512vl(auVar225._0_32_);
                    local_668 = pGVar87;
                    local_380 = local_5a0;
                    local_340 = local_5c0;
                    local_31c = iVar8;
                    bVar90 = local_2d0;
                    do {
                      auVar99 = local_600;
                      auVar234 = auVar235._0_16_;
                      local_4c0 = *(undefined4 *)(ray + k * 4 + 0x80);
                      fVar187 = local_2c0[uVar83];
                      local_220._4_4_ = fVar187;
                      local_220._0_4_ = fVar187;
                      local_220._8_4_ = fVar187;
                      local_220._12_4_ = fVar187;
                      local_210 = *(undefined4 *)((long)&local_2a0 + uVar83 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_280 + uVar83 * 4);
                      local_698.context = context->user;
                      fVar203 = 1.0 - fVar187;
                      auVar34._8_4_ = 0x80000000;
                      auVar34._0_8_ = 0x8000000080000000;
                      auVar34._12_4_ = 0x80000000;
                      auVar103 = vxorps_avx512vl(ZEXT416((uint)fVar203),auVar34);
                      auVar98 = ZEXT416((uint)(fVar187 * fVar203 * 4.0));
                      auVar97 = vfnmsub213ss_fma(local_220,local_220,auVar98);
                      auVar98 = vfmadd213ss_fma(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),
                                                auVar98);
                      fVar203 = fVar203 * auVar103._0_4_ * 0.5;
                      fVar186 = auVar97._0_4_ * 0.5;
                      fVar202 = auVar98._0_4_ * 0.5;
                      fVar187 = fVar187 * fVar187 * 0.5;
                      auVar194._0_4_ = fVar187 * (float)local_610._0_4_;
                      auVar194._4_4_ = fVar187 * (float)local_610._4_4_;
                      auVar194._8_4_ = fVar187 * fStack_608;
                      auVar194._12_4_ = fVar187 * fStack_604;
                      auVar158._4_4_ = fVar202;
                      auVar158._0_4_ = fVar202;
                      auVar158._8_4_ = fVar202;
                      auVar158._12_4_ = fVar202;
                      auVar75._4_4_ = fStack_4dc;
                      auVar75._0_4_ = local_4e0;
                      auVar75._8_4_ = fStack_4d8;
                      auVar75._12_4_ = fStack_4d4;
                      auVar98 = vfmadd132ps_fma(auVar158,auVar194,auVar75);
                      auVar195._4_4_ = fVar186;
                      auVar195._0_4_ = fVar186;
                      auVar195._8_4_ = fVar186;
                      auVar195._12_4_ = fVar186;
                      auVar76._8_8_ = uStack_4c8;
                      auVar76._0_8_ = local_4d0;
                      auVar98 = vfmadd132ps_fma(auVar195,auVar98,auVar76);
                      auVar159._4_4_ = fVar203;
                      auVar159._0_4_ = fVar203;
                      auVar159._8_4_ = fVar203;
                      auVar159._12_4_ = fVar203;
                      auVar98 = vfmadd132ps_fma(auVar159,auVar98,local_6b0);
                      local_250 = auVar98._0_4_;
                      local_240 = vshufps_avx(auVar98,auVar98,0x55);
                      local_230 = vshufps_avx(auVar98,auVar98,0xaa);
                      iStack_24c = local_250;
                      iStack_248 = local_250;
                      iStack_244 = local_250;
                      uStack_20c = local_210;
                      uStack_208 = local_210;
                      uStack_204 = local_210;
                      local_200 = local_4b0._0_8_;
                      uStack_1f8 = local_4b0._8_8_;
                      local_1f0 = local_4a0;
                      vpcmpeqd_avx2(ZEXT1632(local_4a0),ZEXT1632(local_4a0));
                      uStack_1dc = (local_698.context)->instID[0];
                      local_1e0 = uStack_1dc;
                      uStack_1d8 = uStack_1dc;
                      uStack_1d4 = uStack_1dc;
                      uStack_1d0 = (local_698.context)->instPrimID[0];
                      uStack_1cc = uStack_1d0;
                      uStack_1c8 = uStack_1d0;
                      uStack_1c4 = uStack_1d0;
                      local_6d0 = local_3d0._0_8_;
                      uStack_6c8 = local_3d0._8_8_;
                      local_698.valid = (int *)&local_6d0;
                      local_698.geometryUserPtr = pGVar87->userPtr;
                      local_698.hit = (RTCHitN *)&local_250;
                      local_698.N = 4;
                      local_600._1_3_ = 0;
                      local_600[0] = bVar90;
                      local_600._4_12_ = auVar99._4_12_;
                      local_698.ray = (RTCRayN *)ray;
                      if (pGVar87->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar87->intersectionFilterN)(&local_698);
                        auVar121 = vmovdqa64_avx512vl(local_160);
                        auVar225 = ZEXT3264(auVar121);
                        auVar238 = ZEXT3264(local_540);
                        auVar237 = ZEXT3264(local_520);
                        auVar236 = ZEXT3264(local_500);
                        auVar239 = ZEXT3264(local_660);
                        auVar230 = ZEXT3264(local_640);
                        auVar233 = ZEXT3264(local_440);
                        auVar232 = ZEXT3264(local_400);
                        auVar231 = ZEXT3264(local_420);
                        auVar98 = vxorps_avx512vl(auVar234,auVar234);
                        auVar235 = ZEXT1664(auVar98);
                        pGVar87 = local_668;
                        bVar90 = local_600[0];
                      }
                      auVar98 = auVar235._0_16_;
                      auVar71._8_8_ = uStack_6c8;
                      auVar71._0_8_ = local_6d0;
                      uVar91 = vptestmd_avx512vl(auVar71,auVar71);
                      if ((uVar91 & 0xf) == 0) {
LAB_01c49c32:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_4c0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar87->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_698);
                          bVar90 = local_600[0];
                          auVar121 = vmovdqa64_avx512vl(local_160);
                          auVar225 = ZEXT3264(auVar121);
                          auVar238 = ZEXT3264(local_540);
                          auVar237 = ZEXT3264(local_520);
                          auVar236 = ZEXT3264(local_500);
                          auVar239 = ZEXT3264(local_660);
                          auVar230 = ZEXT3264(local_640);
                          auVar233 = ZEXT3264(local_440);
                          auVar232 = ZEXT3264(local_400);
                          auVar231 = ZEXT3264(local_420);
                          auVar98 = vxorps_avx512vl(auVar98,auVar98);
                          auVar235 = ZEXT1664(auVar98);
                          pGVar87 = local_668;
                        }
                        auVar72._8_8_ = uStack_6c8;
                        auVar72._0_8_ = local_6d0;
                        uVar91 = vptestmd_avx512vl(auVar72,auVar72);
                        uVar91 = uVar91 & 0xf;
                        bVar82 = (byte)uVar91;
                        if (bVar82 == 0) goto LAB_01c49c32;
                        iVar1 = *(int *)(local_698.hit + 4);
                        iVar2 = *(int *)(local_698.hit + 8);
                        iVar70 = *(int *)(local_698.hit + 0xc);
                        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                        bVar15 = SUB81(uVar91 >> 3,0);
                        *(uint *)(local_698.ray + 0xc0) =
                             (uint)(bVar82 & 1) * *(int *)local_698.hit |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_698.ray + 0xc0);
                        *(uint *)(local_698.ray + 0xc4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_698.ray + 0xc4);
                        *(uint *)(local_698.ray + 200) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_698.ray + 200);
                        *(uint *)(local_698.ray + 0xcc) =
                             (uint)bVar15 * iVar70 | (uint)!bVar15 * *(int *)(local_698.ray + 0xcc);
                        iVar1 = *(int *)(local_698.hit + 0x14);
                        iVar2 = *(int *)(local_698.hit + 0x18);
                        iVar70 = *(int *)(local_698.hit + 0x1c);
                        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                        bVar15 = SUB81(uVar91 >> 3,0);
                        *(uint *)(local_698.ray + 0xd0) =
                             (uint)(bVar82 & 1) * *(int *)(local_698.hit + 0x10) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_698.ray + 0xd0);
                        *(uint *)(local_698.ray + 0xd4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_698.ray + 0xd4);
                        *(uint *)(local_698.ray + 0xd8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_698.ray + 0xd8);
                        *(uint *)(local_698.ray + 0xdc) =
                             (uint)bVar15 * iVar70 | (uint)!bVar15 * *(int *)(local_698.ray + 0xdc);
                        iVar1 = *(int *)(local_698.hit + 0x24);
                        iVar2 = *(int *)(local_698.hit + 0x28);
                        iVar70 = *(int *)(local_698.hit + 0x2c);
                        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                        bVar15 = SUB81(uVar91 >> 3,0);
                        *(uint *)(local_698.ray + 0xe0) =
                             (uint)(bVar82 & 1) * *(int *)(local_698.hit + 0x20) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_698.ray + 0xe0);
                        *(uint *)(local_698.ray + 0xe4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_698.ray + 0xe4);
                        *(uint *)(local_698.ray + 0xe8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_698.ray + 0xe8);
                        *(uint *)(local_698.ray + 0xec) =
                             (uint)bVar15 * iVar70 | (uint)!bVar15 * *(int *)(local_698.ray + 0xec);
                        iVar1 = *(int *)(local_698.hit + 0x34);
                        iVar2 = *(int *)(local_698.hit + 0x38);
                        iVar70 = *(int *)(local_698.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar91 >> 2) & 1);
                        bVar15 = SUB81(uVar91 >> 3,0);
                        *(uint *)(local_698.ray + 0xf0) =
                             (uint)(bVar82 & 1) * *(int *)(local_698.hit + 0x30) |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_698.ray + 0xf0);
                        *(uint *)(local_698.ray + 0xf4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_698.ray + 0xf4);
                        *(uint *)(local_698.ray + 0xf8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_698.ray + 0xf8);
                        *(uint *)(local_698.ray + 0xfc) =
                             (uint)bVar15 * iVar70 | (uint)!bVar15 * *(int *)(local_698.ray + 0xfc);
                        auVar98 = *(undefined1 (*) [16])(local_698.ray + 0x100);
                        auVar104._0_4_ =
                             (uint)(bVar82 & 1) * *(int *)(local_698.hit + 0x40) |
                             (uint)!(bool)(bVar82 & 1) * auVar98._0_4_;
                        bVar13 = (bool)((byte)(uVar91 >> 1) & 1);
                        auVar104._4_4_ =
                             (uint)bVar13 * *(int *)(local_698.hit + 0x44) |
                             (uint)!bVar13 * auVar98._4_4_;
                        bVar13 = (bool)((byte)(uVar91 >> 2) & 1);
                        auVar104._8_4_ =
                             (uint)bVar13 * *(int *)(local_698.hit + 0x48) |
                             (uint)!bVar13 * auVar98._8_4_;
                        bVar13 = SUB81(uVar91 >> 3,0);
                        auVar104._12_4_ =
                             (uint)bVar13 * *(int *)(local_698.hit + 0x4c) |
                             (uint)!bVar13 * auVar98._12_4_;
                        *(undefined1 (*) [16])(local_698.ray + 0x100) = auVar104;
                        auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x50));
                        *(undefined1 (*) [16])(local_698.ray + 0x110) = auVar98;
                        auVar98 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x60));
                        *(undefined1 (*) [16])(local_698.ray + 0x120) = auVar98;
                        auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x70));
                        *(undefined1 (*) [16])(local_698.ray + 0x130) = auVar98;
                        auVar98 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_698.hit + 0x80));
                        *(undefined1 (*) [16])(local_698.ray + 0x140) = auVar98;
                      }
                      bVar82 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & bVar90;
                      uVar152 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar43._4_4_ = uVar152;
                      auVar43._0_4_ = uVar152;
                      auVar43._8_4_ = uVar152;
                      auVar43._12_4_ = uVar152;
                      auVar43._16_4_ = uVar152;
                      auVar43._20_4_ = uVar152;
                      auVar43._24_4_ = uVar152;
                      auVar43._28_4_ = uVar152;
                      uVar153 = vcmpps_avx512vl(local_5c0,auVar43,2);
                      bVar90 = bVar82 & (byte)uVar153;
                      if ((bVar82 & (byte)uVar153) != 0) {
                        auVar166._8_4_ = 0x7f800000;
                        auVar166._0_8_ = 0x7f8000007f800000;
                        auVar166._12_4_ = 0x7f800000;
                        auVar166._16_4_ = 0x7f800000;
                        auVar166._20_4_ = 0x7f800000;
                        auVar166._24_4_ = 0x7f800000;
                        auVar166._28_4_ = 0x7f800000;
                        auVar121 = vblendmps_avx512vl(auVar166,local_5c0);
                        auVar143._0_4_ =
                             (uint)(bVar90 & 1) * auVar121._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 1 & 1);
                        auVar143._4_4_ = (uint)bVar13 * auVar121._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 2 & 1);
                        auVar143._8_4_ = (uint)bVar13 * auVar121._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 3 & 1);
                        auVar143._12_4_ =
                             (uint)bVar13 * auVar121._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 4 & 1);
                        auVar143._16_4_ =
                             (uint)bVar13 * auVar121._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 5 & 1);
                        auVar143._20_4_ =
                             (uint)bVar13 * auVar121._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar90 >> 6 & 1);
                        auVar143._24_4_ =
                             (uint)bVar13 * auVar121._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar143._28_4_ =
                             (uint)(bVar90 >> 7) * auVar121._28_4_ |
                             (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                        auVar121 = vshufps_avx(auVar143,auVar143,0xb1);
                        auVar121 = vminps_avx(auVar143,auVar121);
                        auVar123 = vshufpd_avx(auVar121,auVar121,5);
                        auVar121 = vminps_avx(auVar121,auVar123);
                        auVar123 = vpermpd_avx2(auVar121,0x4e);
                        auVar121 = vminps_avx(auVar121,auVar123);
                        uVar153 = vcmpps_avx512vl(auVar143,auVar121,0);
                        bVar81 = (byte)uVar153 & bVar90;
                        bVar82 = bVar90;
                        if (bVar81 != 0) {
                          bVar82 = bVar81;
                        }
                        uVar25 = 0;
                        for (uVar84 = (uint)bVar82; (uVar84 & 1) == 0;
                            uVar84 = uVar84 >> 1 | 0x80000000) {
                          uVar25 = uVar25 + 1;
                        }
                        uVar83 = (ulong)uVar25;
                      }
                    } while (bVar90 != 0);
                  }
                }
              }
            }
          }
          lVar85 = lVar85 + 8;
          auVar229 = auVar230;
        } while ((int)lVar85 < iVar8);
      }
      uVar152 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar152;
      auVar32._0_4_ = uVar152;
      auVar32._8_4_ = uVar152;
      auVar32._12_4_ = uVar152;
      uVar153 = vcmpps_avx512vl(local_170,auVar32,2);
      uVar88 = (uint)uVar89 & (uint)uVar89 + 0xf & (uint)uVar153;
      uVar89 = (ulong)uVar88;
    } while (uVar88 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }